

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-idna.c
# Opt level: O3

int run_test_utf8_decode1(void)

{
  char ****ppppcVar1;
  char ****ppppcVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  size_t sVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *****unaff_R14;
  char *****pppppcVar9;
  char *****pppppcVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  char *p;
  char b [32];
  undefined1 auStack_2d8 [4];
  undefined1 auStack_2d4 [12];
  char cStack_2c8;
  char cStack_2c7;
  char cStack_2c6;
  char cStack_2c5;
  char cStack_2c4;
  char cStack_2c3;
  char cStack_2c2;
  char cStack_2c1;
  char cStack_2c0;
  char cStack_2bf;
  char cStack_2be;
  char cStack_2bd;
  char cStack_2bc;
  char cStack_2bb;
  char cStack_2ba;
  char cStack_2b9;
  undefined1 *puStack_2b8;
  char acStack_2b0 [4];
  char cStack_2ac;
  char cStack_2ab;
  char cStack_2aa;
  char cStack_2a9;
  char cStack_2a8;
  char cStack_2a7;
  char cStack_2a6;
  char cStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  char cStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  char cStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  char cStack_299;
  char cStack_298;
  char cStack_297;
  char cStack_296;
  char cStack_295;
  char cStack_294;
  char cStack_293;
  char cStack_292;
  char cStack_291;
  char cStack_1b0;
  char cStack_1af;
  char cStack_1ae;
  char cStack_1ad;
  char cStack_1ac;
  char cStack_1ab;
  char cStack_1aa;
  char cStack_1a9;
  char cStack_1a8;
  char cStack_1a7;
  char cStack_1a6;
  char cStack_1a5;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  char cStack_1a1;
  char cStack_1a0;
  char cStack_19f;
  char cStack_19e;
  char cStack_19d;
  char cStack_19c;
  char cStack_19b;
  char cStack_19a;
  char cStack_199;
  char cStack_198;
  char cStack_197;
  char cStack_196;
  char cStack_195;
  char cStack_194;
  char cStack_193;
  char cStack_192;
  char cStack_191;
  char acStack_b0 [48];
  char ****ppppcStack_80;
  char ****ppppcStack_78;
  char ****ppppcStack_70;
  char ****local_60;
  undefined1 local_58 [2];
  undefined1 auStack_56 [2];
  undefined1 auStack_54 [4];
  undefined1 local_50 [24];
  char ****local_38;
  
  ppppcStack_70 = (char ****)0x15d4c0;
  local_60 = (char ****)local_58;
  snprintf(local_58,0x20,"%c\x7f",0);
  ppppcStack_70 = (char ****)0x15d4d0;
  uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
  if (uVar3 == 0) {
    if (local_60 != (char ****)(local_58 + 1)) goto LAB_0015d7b1;
    ppppcStack_70 = (char ****)0x15d4f5;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    pppppcVar10 = (char *****)local_60;
    if (uVar3 != 0x7f) goto LAB_0015d7b6;
    if (local_60 != (char ****)(local_58 + 2)) goto LAB_0015d7bb;
    _local_58 = (char ****)CONCAT35(auStack_54._1_3_,0xbfdf80c2);
    ppppcStack_70 = (char ****)0x15d52e;
    local_60 = (char ****)local_58;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0x80) goto LAB_0015d7c0;
    if ((char *****)local_60 != pppppcVar10) goto LAB_0015d7c5;
    ppppcStack_70 = (char ****)0x15d551;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    ppppcVar1 = local_60;
    if (uVar3 != 0x7ff) goto LAB_0015d7ca;
    if (local_60 != (char ****)(local_58 + 4)) goto LAB_0015d7cf;
    _local_58 = (char ****)CONCAT17(auStack_54[3],0xbfbfef80a0e0);
    ppppcStack_70 = (char ****)0x15d58f;
    local_60 = (char ****)local_58;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0x800) goto LAB_0015d7d4;
    if (local_60 != (char ****)(local_58 + 3)) goto LAB_0015d7d9;
    local_38 = local_60;
    ppppcStack_70 = (char ****)0x15d5bf;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    ppppcVar2 = local_60;
    if (uVar3 != 0xffff) goto LAB_0015d7de;
    if (local_60 != (char ****)(local_58 + 6)) goto LAB_0015d7e3;
    _local_58 = (char ****)0xbfbf8ff4808090f0;
    local_50[0] = 0;
    ppppcStack_70 = (char ****)0x15d601;
    local_60 = (char ****)local_58;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0x10000) goto LAB_0015d7e8;
    if (local_60 != ppppcVar1) goto LAB_0015d7ed;
    ppppcStack_70 = (char ****)0x15d624;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    pppppcVar9 = (char *****)local_60;
    if (uVar3 != 0x10ffff) goto LAB_0015d7f2;
    if (local_60 != (char ****)local_50) goto LAB_0015d7f7;
    _local_58 = (char ****)0xbfbfbff7c0c090f4;
    local_50[0] = 0;
    ppppcStack_70 = (char ****)0x15d666;
    local_60 = (char ****)local_58;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0xffffffff) goto LAB_0015d7fc;
    if (local_60 != ppppcVar1) goto LAB_0015d801;
    ppppcStack_70 = (char ****)0x15d687;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0xffffffff) goto LAB_0015d806;
    if ((char *****)local_60 != pppppcVar9) goto LAB_0015d80b;
    _local_58 = (char ****)CONCAT35(auStack_54._1_3_,0x80c180c0);
    ppppcStack_70 = (char ****)0x15d6b8;
    local_60 = (char ****)local_58;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0xffffffff) goto LAB_0015d810;
    if ((char *****)local_60 != pppppcVar10) goto LAB_0015d815;
    ppppcStack_70 = (char ****)0x15d6d9;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0xffffffff) goto LAB_0015d81a;
    if (local_60 != ppppcVar1) goto LAB_0015d81f;
    _local_58 = (char ****)CONCAT17(auStack_54[3],0xbfa3ed80a0ed);
    ppppcStack_70 = (char ****)0x15d70d;
    local_60 = (char ****)local_58;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0xffffffff) goto LAB_0015d824;
    if (local_60 != local_38) goto LAB_0015d829;
    ppppcStack_70 = (char ****)0x15d733;
    uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
    if (uVar3 != 0xffffffff) goto LAB_0015d82e;
    if (local_60 == ppppcVar2) {
      _local_58 = (char ****)0xfffefdfcfbfaf9f8;
      local_50[0] = 0;
      unaff_R14 = (char *****)0x1;
      local_60 = (char ****)local_58;
      while( true ) {
        ppppcStack_70 = (char ****)0x15d774;
        uVar3 = uv__utf8_decode1((char **)&local_60,(char *)&local_38);
        if (uVar3 != 0xffffffff) break;
        if ((char ****)(local_58 + (long)unaff_R14) != local_60) {
          ppppcStack_70 = (char ****)0x15d7a7;
          run_test_utf8_decode1_cold_30();
          break;
        }
        unaff_R14 = (char *****)((long)unaff_R14 + 1);
        if (unaff_R14 == (char *****)0x9) {
          return 0;
        }
      }
      ppppcStack_70 = (char ****)0x15d7ac;
      run_test_utf8_decode1_cold_29();
      goto LAB_0015d7ac;
    }
  }
  else {
LAB_0015d7ac:
    ppppcStack_70 = (char ****)0x15d7b1;
    run_test_utf8_decode1_cold_1();
LAB_0015d7b1:
    ppppcStack_70 = (char ****)0x15d7b6;
    run_test_utf8_decode1_cold_2();
LAB_0015d7b6:
    pppppcVar10 = &local_60;
    ppppcStack_70 = (char ****)0x15d7bb;
    run_test_utf8_decode1_cold_3();
LAB_0015d7bb:
    ppppcStack_70 = (char ****)0x15d7c0;
    run_test_utf8_decode1_cold_4();
LAB_0015d7c0:
    ppppcStack_70 = (char ****)0x15d7c5;
    run_test_utf8_decode1_cold_5();
LAB_0015d7c5:
    ppppcStack_70 = (char ****)0x15d7ca;
    run_test_utf8_decode1_cold_6();
LAB_0015d7ca:
    ppppcStack_70 = (char ****)0x15d7cf;
    run_test_utf8_decode1_cold_7();
LAB_0015d7cf:
    ppppcStack_70 = (char ****)0x15d7d4;
    run_test_utf8_decode1_cold_8();
LAB_0015d7d4:
    ppppcStack_70 = (char ****)0x15d7d9;
    run_test_utf8_decode1_cold_9();
LAB_0015d7d9:
    ppppcStack_70 = (char ****)0x15d7de;
    run_test_utf8_decode1_cold_10();
LAB_0015d7de:
    ppppcStack_70 = (char ****)0x15d7e3;
    run_test_utf8_decode1_cold_11();
LAB_0015d7e3:
    ppppcStack_70 = (char ****)0x15d7e8;
    run_test_utf8_decode1_cold_12();
LAB_0015d7e8:
    ppppcStack_70 = (char ****)0x15d7ed;
    run_test_utf8_decode1_cold_13();
LAB_0015d7ed:
    ppppcStack_70 = (char ****)0x15d7f2;
    run_test_utf8_decode1_cold_14();
LAB_0015d7f2:
    pppppcVar9 = unaff_R14;
    ppppcStack_70 = (char ****)0x15d7f7;
    run_test_utf8_decode1_cold_15();
LAB_0015d7f7:
    ppppcStack_70 = (char ****)0x15d7fc;
    run_test_utf8_decode1_cold_16();
LAB_0015d7fc:
    ppppcStack_70 = (char ****)0x15d801;
    run_test_utf8_decode1_cold_17();
LAB_0015d801:
    ppppcStack_70 = (char ****)0x15d806;
    run_test_utf8_decode1_cold_18();
LAB_0015d806:
    ppppcStack_70 = (char ****)0x15d80b;
    run_test_utf8_decode1_cold_19();
LAB_0015d80b:
    ppppcStack_70 = (char ****)0x15d810;
    run_test_utf8_decode1_cold_20();
LAB_0015d810:
    ppppcStack_70 = (char ****)0x15d815;
    run_test_utf8_decode1_cold_21();
LAB_0015d815:
    ppppcStack_70 = (char ****)0x15d81a;
    run_test_utf8_decode1_cold_22();
LAB_0015d81a:
    ppppcStack_70 = (char ****)0x15d81f;
    run_test_utf8_decode1_cold_23();
LAB_0015d81f:
    ppppcStack_70 = (char ****)0x15d824;
    run_test_utf8_decode1_cold_24();
LAB_0015d824:
    ppppcStack_70 = (char ****)0x15d829;
    run_test_utf8_decode1_cold_25();
LAB_0015d829:
    ppppcStack_70 = (char ****)0x15d82e;
    run_test_utf8_decode1_cold_26();
LAB_0015d82e:
    ppppcStack_70 = (char ****)0x15d833;
    run_test_utf8_decode1_cold_27();
  }
  ppppcStack_70 = (char ****)run_test_idna_toascii;
  run_test_utf8_decode1_cold_28();
  puStack_2b8 = (undefined1 *)0x15d856;
  ppppcStack_80 = (char ****)&local_38;
  ppppcStack_78 = (char ****)pppppcVar9;
  ppppcStack_70 = (char ****)pppppcVar10;
  memset(acStack_2b0,0,0x100);
  puStack_2b8 = (undefined1 *)0x15d874;
  lVar5 = uv__idna_toascii(anon_var_dwarf_38f9a,anon_var_dwarf_38f9a + 4,acStack_2b0,&cStack_1b0);
  if (lVar5 == -0x16) {
    puStack_2b8 = (undefined1 *)0x15d890;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d8ae;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_1,run_test_idna_toascii::s_1 + 8,acStack_2b0,
                             &cStack_1b0);
    if (lVar5 != -0x16) goto LAB_001606c2;
    puStack_2b8 = (undefined1 *)0x15d8ca;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d8de;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d8f8;
    lVar5 = uv__idna_toascii("","",acStack_2b0,&cStack_1b0);
    if (lVar5 != 1) goto LAB_001606c7;
    if (acStack_2b0[0] != '\0') goto LAB_001606cc;
    puStack_2b8 = (undefined1 *)0x15d917;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d933;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 1) goto LAB_001606d1;
    if (cStack_1b0 != '\0') goto LAB_001606d6;
    puStack_2b8 = (undefined1 *)0x15d960;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001606db;
    puStack_2b8 = (undefined1 *)0x15d97a;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d98e;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15d9ac;
    lVar5 = uv__idna_toascii(".","",acStack_2b0,&cStack_1b0);
    if (lVar5 != 2) goto LAB_001606e0;
    if (CONCAT11(acStack_2b0[1],acStack_2b0[0]) != 0x2e) goto LAB_001606e5;
    puStack_2b8 = (undefined1 *)0x15d9cc;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15d9e8;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 2) goto LAB_001606ea;
    if (CONCAT11(cStack_1af,cStack_1b0) != 0x2e) goto LAB_001606ef;
    puStack_2b8 = (undefined1 *)0x15da16;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001606f4;
    puStack_2b8 = (undefined1 *)0x15da30;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15da44;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15da62;
    lVar5 = uv__idna_toascii(".com","",acStack_2b0,&cStack_1b0);
    if (lVar5 != 5) goto LAB_001606f9;
    if (cStack_2ac != '\0' ||
        CONCAT13(acStack_2b0[3],CONCAT12(acStack_2b0[2],CONCAT11(acStack_2b0[1],acStack_2b0[0]))) !=
        0x6d6f632e) goto LAB_001606fe;
    puStack_2b8 = (undefined1 *)0x15da8c;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15daa8;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 5) goto LAB_00160703;
    if (cStack_1ac != '\0' ||
        CONCAT13(cStack_1ad,CONCAT12(cStack_1ae,CONCAT11(cStack_1af,cStack_1b0))) != 0x6d6f632e)
    goto LAB_00160708;
    puStack_2b8 = (undefined1 *)0x15dae3;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_0016070d;
    puStack_2b8 = (undefined1 *)0x15dafd;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15db11;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15db2f;
    lVar5 = uv__idna_toascii("example","",acStack_2b0,&cStack_1b0);
    if (lVar5 != 8) goto LAB_00160712;
    if (CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x656c706d617865)
    goto LAB_00160717;
    puStack_2b8 = (undefined1 *)0x15db58;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15db74;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 8) goto LAB_0016071c;
    if (CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x656c706d617865) goto LAB_00160721;
    puStack_2b8 = (undefined1 *)0x15dba1;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160726;
    puStack_2b8 = (undefined1 *)0x15dbbb;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dbcf;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dbed;
    lVar5 = uv__idna_toascii("example-","",acStack_2b0,&cStack_1b0);
    if (lVar5 != 9) goto LAB_0016072b;
    if (cStack_2a8 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x2d656c706d617865)
    goto LAB_00160730;
    puStack_2b8 = (undefined1 *)0x15dc21;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15dc3d;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 9) goto LAB_00160735;
    if (cStack_1a8 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2d656c706d617865) goto LAB_0016073a;
    puStack_2b8 = (undefined1 *)0x15dc75;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_0016073f;
    puStack_2b8 = (undefined1 *)0x15dc8f;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dca3;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dcc1;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_7,run_test_idna_toascii::s_7 + 10,acStack_2b0,
                             &cStack_1b0);
    if (lVar5 != 0x11) goto LAB_00160744;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x617274732d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x65642e61716f2d65) goto LAB_00160749;
    puStack_2b8 = (undefined1 *)0x15dd0a;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15dd26;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x11) goto LAB_0016074e;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x617274732d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x65642e61716f2d65) goto LAB_00160753;
    puStack_2b8 = (undefined1 *)0x15dd69;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160758;
    puStack_2b8 = (undefined1 *)0x15dd83;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15dd97;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ddb5;
    lVar5 = uv__idna_toascii("foo.bar","",acStack_2b0,&cStack_1b0);
    if (lVar5 != 8) goto LAB_0016075d;
    if (CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x7261622e6f6f66)
    goto LAB_00160762;
    puStack_2b8 = (undefined1 *)0x15ddde;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ddfa;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 8) goto LAB_00160767;
    if (CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x7261622e6f6f66) goto LAB_0016076c;
    puStack_2b8 = (undefined1 *)0x15de27;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160771;
    puStack_2b8 = (undefined1 *)0x15de41;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15de55;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15de73;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_9,run_test_idna_toascii::s_9 + 0xb,acStack_2b0
                             ,&cStack_1b0);
    if (lVar5 != 0x12) goto LAB_00160776;
    auVar11[0] = -(acStack_2b0[0] == 'x');
    auVar11[1] = -(acStack_2b0[1] == 'n');
    auVar11[2] = -(acStack_2b0[2] == '-');
    auVar11[3] = -(acStack_2b0[3] == '-');
    auVar11[4] = -(cStack_2ac == 'm');
    auVar11[5] = -(cStack_2ab == 'a');
    auVar11[6] = -(cStack_2aa == 'a');
    auVar11[7] = -(cStack_2a9 == 'n');
    auVar11[8] = -(cStack_2a8 == 'a');
    auVar11[9] = -(cStack_2a7 == '-');
    auVar11[10] = -(cStack_2a6 == 'p');
    auVar11[0xb] = -(cStack_2a5 == 't');
    auVar11[0xc] = -(cStack_2a4 == 'a');
    auVar11[0xd] = -(cStack_2a3 == '.');
    auVar11[0xe] = -(cStack_2a2 == 'c');
    auVar11[0xf] = -(cStack_2a1 == 'o');
    auVar49[0] = -(cStack_2a0 == 'm');
    auVar49[1] = -(cStack_29f == '\0');
    auVar49[2] = 0xff;
    auVar49[3] = 0xff;
    auVar49[4] = 0xff;
    auVar49[5] = 0xff;
    auVar49[6] = 0xff;
    auVar49[7] = 0xff;
    auVar49[8] = 0xff;
    auVar49[9] = 0xff;
    auVar49[10] = 0xff;
    auVar49[0xb] = 0xff;
    auVar49[0xc] = 0xff;
    auVar49[0xd] = 0xff;
    auVar49[0xe] = 0xff;
    auVar49[0xf] = 0xff;
    auVar49 = auVar49 & auVar11;
    if ((ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) | (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar49[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016077b;
    puStack_2b8 = (undefined1 *)0x15deb9;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ded5;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x12) goto LAB_00160780;
    auVar12[0] = -(cStack_1a0 == 'm');
    auVar12[1] = -(cStack_19f == '\0');
    auVar12[2] = 0xff;
    auVar12[3] = 0xff;
    auVar12[4] = 0xff;
    auVar12[5] = 0xff;
    auVar12[6] = 0xff;
    auVar12[7] = 0xff;
    auVar12[8] = 0xff;
    auVar12[9] = 0xff;
    auVar12[10] = 0xff;
    auVar12[0xb] = 0xff;
    auVar12[0xc] = 0xff;
    auVar12[0xd] = 0xff;
    auVar12[0xe] = 0xff;
    auVar12[0xf] = 0xff;
    builtin_strncpy(acStack_b0,"xn--maana-pta.co",0x10);
    auVar50[0] = -(cStack_1b0 == 'x');
    auVar50[1] = -(cStack_1af == 'n');
    auVar50[2] = -(cStack_1ae == '-');
    auVar50[3] = -(cStack_1ad == '-');
    auVar50[4] = -(cStack_1ac == 'm');
    auVar50[5] = -(cStack_1ab == 'a');
    auVar50[6] = -(cStack_1aa == 'a');
    auVar50[7] = -(cStack_1a9 == 'n');
    auVar50[8] = -(cStack_1a8 == 'a');
    auVar50[9] = -(cStack_1a7 == '-');
    auVar50[10] = -(cStack_1a6 == 'p');
    auVar50[0xb] = -(cStack_1a5 == 't');
    auVar50[0xc] = -(cStack_1a4 == 'a');
    auVar50[0xd] = -(cStack_1a3 == '.');
    auVar50[0xe] = -(cStack_1a2 == 'c');
    auVar50[0xf] = -(cStack_1a1 == 'o');
    auVar12 = auVar12 & auVar50;
    if ((ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) | (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160785;
    puStack_2b8 = (undefined1 *)0x15df53;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_0016078a;
    puStack_2b8 = (undefined1 *)0x15df6d;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15df81;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15df9f;
    lVar5 = uv__idna_toascii("example.com.","",acStack_2b0,&cStack_1b0);
    if (lVar5 != 0xd) goto LAB_0016078f;
    if (CONCAT17(cStack_2a4,
                 CONCAT16(cStack_2a5,
                          CONCAT15(cStack_2a6,
                                   CONCAT14(cStack_2a7,
                                            CONCAT13(cStack_2a8,
                                                     CONCAT12(cStack_2a9,
                                                              CONCAT11(cStack_2aa,cStack_2ab)))))))
        != 0x2e6d6f632e656c ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x2e656c706d617865)
    goto LAB_00160794;
    puStack_2b8 = (undefined1 *)0x15dfe0;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15dffc;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0xd) goto LAB_00160799;
    if (CONCAT17(cStack_1a4,
                 CONCAT16(cStack_1a5,
                          CONCAT15(cStack_1a6,
                                   CONCAT14(cStack_1a7,
                                            CONCAT13(cStack_1a8,
                                                     CONCAT12(cStack_1a9,
                                                              CONCAT11(cStack_1aa,cStack_1ab)))))))
        != 0x2e6d6f632e656c ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2e656c706d617865) goto LAB_0016079e;
    puStack_2b8 = (undefined1 *)0x15e034;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001607a3;
    puStack_2b8 = (undefined1 *)0x15e04e;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e062;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e080;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_11,run_test_idna_toascii::s_11 + 0xb,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x12) goto LAB_001607a8;
    auVar13[0] = -(acStack_2b0[0] == 'x');
    auVar13[1] = -(acStack_2b0[1] == 'n');
    auVar13[2] = -(acStack_2b0[2] == '-');
    auVar13[3] = -(acStack_2b0[3] == '-');
    auVar13[4] = -(cStack_2ac == 'b');
    auVar13[5] = -(cStack_2ab == 'c');
    auVar13[6] = -(cStack_2aa == 'h');
    auVar13[7] = -(cStack_2a9 == 'e');
    auVar13[8] = -(cStack_2a8 == 'r');
    auVar13[9] = -(cStack_2a7 == '-');
    auVar13[10] = -(cStack_2a6 == 'k');
    auVar13[0xb] = -(cStack_2a5 == 'v');
    auVar13[0xc] = -(cStack_2a4 == 'a');
    auVar13[0xd] = -(cStack_2a3 == '.');
    auVar13[0xe] = -(cStack_2a2 == 'c');
    auVar13[0xf] = -(cStack_2a1 == 'o');
    auVar51[0] = -(cStack_2a0 == 'm');
    auVar51[1] = -(cStack_29f == '\0');
    auVar51[2] = 0xff;
    auVar51[3] = 0xff;
    auVar51[4] = 0xff;
    auVar51[5] = 0xff;
    auVar51[6] = 0xff;
    auVar51[7] = 0xff;
    auVar51[8] = 0xff;
    auVar51[9] = 0xff;
    auVar51[10] = 0xff;
    auVar51[0xb] = 0xff;
    auVar51[0xc] = 0xff;
    auVar51[0xd] = 0xff;
    auVar51[0xe] = 0xff;
    auVar51[0xf] = 0xff;
    auVar51 = auVar51 & auVar13;
    if ((ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) | (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar51[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001607ad;
    puStack_2b8 = (undefined1 *)0x15e0c6;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e0e2;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x12) goto LAB_001607b2;
    auVar14[0] = -(cStack_1b0 == 'x');
    auVar14[1] = -(cStack_1af == 'n');
    auVar14[2] = -(cStack_1ae == '-');
    auVar14[3] = -(cStack_1ad == '-');
    auVar14[4] = -(cStack_1ac == 'b');
    auVar14[5] = -(cStack_1ab == 'c');
    auVar14[6] = -(cStack_1aa == 'h');
    auVar14[7] = -(cStack_1a9 == 'e');
    auVar14[8] = -(cStack_1a8 == 'r');
    auVar14[9] = -(cStack_1a7 == '-');
    auVar14[10] = -(cStack_1a6 == 'k');
    auVar14[0xb] = -(cStack_1a5 == 'v');
    auVar14[0xc] = -(cStack_1a4 == 'a');
    auVar14[0xd] = -(cStack_1a3 == '.');
    auVar14[0xe] = -(cStack_1a2 == 'c');
    auVar14[0xf] = -(cStack_1a1 == 'o');
    auVar52[0] = -(cStack_1a0 == 'm');
    auVar52[1] = -(cStack_19f == '\0');
    auVar52[2] = 0xff;
    auVar52[3] = 0xff;
    auVar52[4] = 0xff;
    auVar52[5] = 0xff;
    auVar52[6] = 0xff;
    auVar52[7] = 0xff;
    auVar52[8] = 0xff;
    auVar52[9] = 0xff;
    auVar52[10] = 0xff;
    auVar52[0xb] = 0xff;
    auVar52[0xc] = 0xff;
    auVar52[0xd] = 0xff;
    auVar52[0xe] = 0xff;
    auVar52[0xf] = 0xff;
    auVar52 = auVar52 & auVar14;
    if ((ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) | (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar52[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001607b7;
    puStack_2b8 = (undefined1 *)0x15e153;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001607bc;
    puStack_2b8 = (undefined1 *)0x15e16d;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e181;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e19f;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_12,run_test_idna_toascii::s_12 + 9,acStack_2b0
                             ,&cStack_1b0);
    if (lVar5 != 0x10) goto LAB_001607c1;
    auVar15[0] = -(acStack_2b0[0] == 'x');
    auVar15[1] = -(acStack_2b0[1] == 'n');
    auVar15[2] = -(acStack_2b0[2] == '-');
    auVar15[3] = -(acStack_2b0[3] == '-');
    auVar15[4] = -(cStack_2ac == 'c');
    auVar15[5] = -(cStack_2ab == 'a');
    auVar15[6] = -(cStack_2aa == 'f');
    auVar15[7] = -(cStack_2a9 == '-');
    auVar15[8] = -(cStack_2a8 == 'd');
    auVar15[9] = -(cStack_2a7 == 'm');
    auVar15[10] = -(cStack_2a6 == 'a');
    auVar15[0xb] = -(cStack_2a5 == '.');
    auVar15[0xc] = -(cStack_2a4 == 'c');
    auVar15[0xd] = -(cStack_2a3 == 'o');
    auVar15[0xe] = -(cStack_2a2 == 'm');
    auVar15[0xf] = -(cStack_2a1 == '\0');
    if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) | (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe | (ushort)(auVar15[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001607c6;
    puStack_2b8 = (undefined1 *)0x15e1d0;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e1ec;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x10) goto LAB_001607cb;
    if (CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6d6f632e616d64 ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2d6661632d2d6e78) goto LAB_001607d0;
    puStack_2b8 = (undefined1 *)0x15e23e;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001607d5;
    puStack_2b8 = (undefined1 *)0x15e258;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e26c;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e28a;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_13,run_test_idna_toascii::s_13 + 0xf,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x1c) goto LAB_001607da;
    builtin_strncpy(acStack_b0 + 0x20,"xn--caf-",9);
    acStack_b0[0x29] = '\0';
    acStack_b0[0x2a] = '\0';
    acStack_b0[0x2b] = '\0';
    acStack_b0[0x2c] = '\0';
    acStack_b0[0x2d] = '\0';
    acStack_b0[0x2e] = '\0';
    acStack_b0[0x2f] = '\0';
    auVar16[0] = -(acStack_2b0[0] == 'x');
    auVar16[1] = -(acStack_2b0[1] == 'n');
    auVar16[2] = -(acStack_2b0[2] == '-');
    auVar16[3] = -(acStack_2b0[3] == '-');
    auVar16[4] = -(cStack_2ac == 'c');
    auVar16[5] = -(cStack_2ab == 'a');
    auVar16[6] = -(cStack_2aa == 'f');
    auVar16[7] = -(cStack_2a9 == '-');
    auVar16[8] = -(cStack_2a8 == 'd');
    auVar16[9] = -(cStack_2a7 == 'm');
    auVar16[10] = -(cStack_2a6 == 'a');
    auVar16[0xb] = -(cStack_2a5 == '.');
    auVar16[0xc] = -(cStack_2a4 == 'x');
    auVar16[0xd] = -(cStack_2a3 == 'n');
    auVar16[0xe] = -(cStack_2a2 == '-');
    auVar16[0xf] = -(cStack_2a1 == '-');
    builtin_strncpy(acStack_b0 + 0x10,"xn--caf-dma.com",0x10);
    auVar53[0] = -(cStack_2a4 == 'x');
    auVar53[1] = -(cStack_2a3 == 'n');
    auVar53[2] = -(cStack_2a2 == '-');
    auVar53[3] = -(cStack_2a1 == '-');
    auVar53[4] = -(cStack_2a0 == 'c');
    auVar53[5] = -(cStack_29f == 'a');
    auVar53[6] = -(cStack_29e == 'f');
    auVar53[7] = -(cStack_29d == '-');
    auVar53[8] = -(cStack_29c == 'd');
    auVar53[9] = -(cStack_29b == 'm');
    auVar53[10] = -(cStack_29a == 'a');
    auVar53[0xb] = -(cStack_299 == '.');
    auVar53[0xc] = -(cStack_298 == 'c');
    auVar53[0xd] = -(cStack_297 == 'o');
    auVar53[0xe] = -(cStack_296 == 'm');
    auVar53[0xf] = -(cStack_295 == '\0');
    auVar16 = auVar16 & auVar53;
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001607df;
    puStack_2b8 = (undefined1 *)0x15e2e9;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e305;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x1c) goto LAB_001607e4;
    auVar54[0] = -(acStack_b0[0x20] == cStack_1b0);
    auVar54[1] = -(acStack_b0[0x21] == cStack_1af);
    auVar54[2] = -(acStack_b0[0x22] == cStack_1ae);
    auVar54[3] = -(acStack_b0[0x23] == cStack_1ad);
    auVar54[4] = -(acStack_b0[0x24] == cStack_1ac);
    auVar54[5] = -(acStack_b0[0x25] == cStack_1ab);
    auVar54[6] = -(acStack_b0[0x26] == cStack_1aa);
    auVar54[7] = -(acStack_b0[0x27] == cStack_1a9);
    auVar54[8] = -(cStack_1a8 == 'd');
    auVar54[9] = -(cStack_1a7 == 'm');
    auVar54[10] = -(cStack_1a6 == 'a');
    auVar54[0xb] = -(cStack_1a5 == '.');
    auVar54[0xc] = -(cStack_1a4 == 'x');
    auVar54[0xd] = -(cStack_1a3 == 'n');
    auVar54[0xe] = -(cStack_1a2 == '-');
    auVar54[0xf] = -(cStack_1a1 == '-');
    auVar17[0] = -(cStack_1a4 == acStack_b0[0x10]);
    auVar17[1] = -(cStack_1a3 == acStack_b0[0x11]);
    auVar17[2] = -(cStack_1a2 == acStack_b0[0x12]);
    auVar17[3] = -(cStack_1a1 == acStack_b0[0x13]);
    auVar17[4] = -(cStack_1a0 == acStack_b0[0x14]);
    auVar17[5] = -(cStack_19f == acStack_b0[0x15]);
    auVar17[6] = -(cStack_19e == acStack_b0[0x16]);
    auVar17[7] = -(cStack_19d == acStack_b0[0x17]);
    auVar17[8] = -(cStack_19c == acStack_b0[0x18]);
    auVar17[9] = -(cStack_19b == acStack_b0[0x19]);
    auVar17[10] = -(cStack_19a == acStack_b0[0x1a]);
    auVar17[0xb] = -(cStack_199 == acStack_b0[0x1b]);
    auVar17[0xc] = -(cStack_198 == acStack_b0[0x1c]);
    auVar17[0xd] = -(cStack_197 == acStack_b0[0x1d]);
    auVar17[0xe] = -(cStack_196 == acStack_b0[0x1e]);
    auVar17[0xf] = -(cStack_195 == acStack_b0[0x1f]);
    auVar54 = auVar54 & auVar17;
    if ((ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) | (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar54[0xf] >> 7) << 0xf) != 0xffff) goto LAB_001607e9;
    puStack_2b8 = (undefined1 *)0x15e36e;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001607ee;
    puStack_2b8 = (undefined1 *)0x15e388;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e39c;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e3ba;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_14,run_test_idna_toascii::s_14 + 0xb,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x11) goto LAB_001607f3;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x71642d2d2d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x6d6f632e6b34336f) goto LAB_001607f8;
    puStack_2b8 = (undefined1 *)0x15e403;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e41f;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x11) goto LAB_001607fd;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x71642d2d2d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6d6f632e6b34336f) goto LAB_00160802;
    puStack_2b8 = (undefined1 *)0x15e465;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160807;
    puStack_2b8 = (undefined1 *)0x15e47f;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e493;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e4b1;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_15,run_test_idna_toascii::s_15 + 0xe,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x15) goto LAB_0016080c;
    auVar55[0] = -(cStack_2ab == '-');
    auVar55[1] = -(cStack_2aa == 'd');
    auVar55[2] = -(cStack_2a9 == 'q');
    auVar55[3] = -(cStack_2a8 == 'o');
    auVar55[4] = -(cStack_2a7 == '3');
    auVar55[5] = -(cStack_2a6 == '4');
    auVar55[6] = -(cStack_2a5 == 'k');
    auVar55[7] = -(cStack_2a4 == 'n');
    auVar55[8] = -(cStack_2a3 == '6');
    auVar55[9] = -(cStack_2a2 == '5');
    auVar55[10] = -(cStack_2a1 == 'z');
    auVar55[0xb] = -(cStack_2a0 == '.');
    auVar55[0xc] = -(cStack_29f == 'c');
    auVar55[0xd] = -(cStack_29e == 'o');
    auVar55[0xe] = -(cStack_29d == 'm');
    auVar55[0xf] = -(cStack_29c == '\0');
    auVar18[0] = -(acStack_2b0[0] == 'x');
    auVar18[1] = -(acStack_2b0[1] == 'n');
    auVar18[2] = -(acStack_2b0[2] == '-');
    auVar18[3] = -(acStack_2b0[3] == '-');
    auVar18[4] = -(cStack_2ac == '-');
    auVar18[5] = -(cStack_2ab == '-');
    auVar18[6] = -(cStack_2aa == 'd');
    auVar18[7] = -(cStack_2a9 == 'q');
    auVar18[8] = -(cStack_2a8 == 'o');
    auVar18[9] = -(cStack_2a7 == '3');
    auVar18[10] = -(cStack_2a6 == '4');
    auVar18[0xb] = -(cStack_2a5 == 'k');
    auVar18[0xc] = -(cStack_2a4 == 'n');
    auVar18[0xd] = -(cStack_2a3 == '6');
    auVar18[0xe] = -(cStack_2a2 == '5');
    auVar18[0xf] = -(cStack_2a1 == 'z');
    auVar18 = auVar18 & auVar55;
    if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) | (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160811;
    puStack_2b8 = (undefined1 *)0x15e4f4;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e510;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x15) goto LAB_00160816;
    auVar19[0] = -(cStack_1b0 == 'x');
    auVar19[1] = -(cStack_1af == 'n');
    auVar19[2] = -(cStack_1ae == '-');
    auVar19[3] = -(cStack_1ad == '-');
    auVar19[4] = -(cStack_1ac == '-');
    auVar19[5] = -(cStack_1ab == '-');
    auVar19[6] = -(cStack_1aa == 'd');
    auVar19[7] = -(cStack_1a9 == 'q');
    auVar19[8] = -(cStack_1a8 == 'o');
    auVar19[9] = -(cStack_1a7 == '3');
    auVar19[10] = -(cStack_1a6 == '4');
    auVar19[0xb] = -(cStack_1a5 == 'k');
    auVar19[0xc] = -(cStack_1a4 == 'n');
    auVar19[0xd] = -(cStack_1a3 == '6');
    auVar19[0xe] = -(cStack_1a2 == '5');
    auVar19[0xf] = -(cStack_1a1 == 'z');
    auVar78[0] = -(cStack_1ab == '-');
    auVar78[1] = -(cStack_1aa == 'd');
    auVar78[2] = -(cStack_1a9 == 'q');
    auVar78[3] = -(cStack_1a8 == 'o');
    auVar78[4] = -(cStack_1a7 == '3');
    auVar78[5] = -(cStack_1a6 == '4');
    auVar78[6] = -(cStack_1a5 == 'k');
    auVar78[7] = -(cStack_1a4 == 'n');
    auVar78[8] = -(cStack_1a3 == '6');
    auVar78[9] = -(cStack_1a2 == '5');
    auVar78[10] = -(cStack_1a1 == 'z');
    auVar78[0xb] = -(cStack_1a0 == '.');
    auVar78[0xc] = -(cStack_19f == 'c');
    auVar78[0xd] = -(cStack_19e == 'o');
    auVar78[0xe] = -(cStack_19d == 'm');
    auVar78[0xf] = -(cStack_19c == '\0');
    auVar19 = auVar19 & auVar78;
    if ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016081b;
    puStack_2b8 = (undefined1 *)0x15e592;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160820;
    puStack_2b8 = (undefined1 *)0x15e5ac;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e5c0;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e5de;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_16,run_test_idna_toascii::s_16 + 7,acStack_2b0
                             ,&cStack_1b0);
    if (lVar5 != 0xc) goto LAB_00160825;
    if (CONCAT13(cStack_2a5,CONCAT12(cStack_2a6,CONCAT11(cStack_2a7,cStack_2a8))) != 0x616c2e ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x6838736c2d2d6e78)
    goto LAB_0016082a;
    puStack_2b8 = (undefined1 *)0x15e618;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e634;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0xc) goto LAB_0016082f;
    if (CONCAT13(cStack_1a5,CONCAT12(cStack_1a6,CONCAT11(cStack_1a7,cStack_1a8))) != 0x616c2e ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x6838736c2d2d6e78) goto LAB_00160834;
    puStack_2b8 = (undefined1 *)0x15e671;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160839;
    puStack_2b8 = (undefined1 *)0x15e68b;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e69f;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e6bd;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_17,run_test_idna_toascii::s_17 + 0xb,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x12) goto LAB_0016083e;
    auVar20[0] = -(cStack_2a0 == 'm');
    auVar20[1] = -(cStack_29f == '\0');
    auVar20[2] = 0xff;
    auVar20[3] = 0xff;
    auVar20[4] = 0xff;
    auVar20[5] = 0xff;
    auVar20[6] = 0xff;
    auVar20[7] = 0xff;
    auVar20[8] = 0xff;
    auVar20[9] = 0xff;
    auVar20[10] = 0xff;
    auVar20[0xb] = 0xff;
    auVar20[0xc] = 0xff;
    auVar20[0xd] = 0xff;
    auVar20[0xe] = 0xff;
    auVar20[0xf] = 0xff;
    auVar56[0] = -(acStack_2b0[0] == acStack_b0[0]);
    auVar56[1] = -(acStack_2b0[1] == acStack_b0[1]);
    auVar56[2] = -(acStack_2b0[2] == acStack_b0[2]);
    auVar56[3] = -(acStack_2b0[3] == acStack_b0[3]);
    auVar56[4] = -(cStack_2ac == acStack_b0[4]);
    auVar56[5] = -(cStack_2ab == acStack_b0[5]);
    auVar56[6] = -(cStack_2aa == acStack_b0[6]);
    auVar56[7] = -(cStack_2a9 == acStack_b0[7]);
    auVar56[8] = -(cStack_2a8 == acStack_b0[8]);
    auVar56[9] = -(cStack_2a7 == acStack_b0[9]);
    auVar56[10] = -(cStack_2a6 == acStack_b0[10]);
    auVar56[0xb] = -(cStack_2a5 == acStack_b0[0xb]);
    auVar56[0xc] = -(cStack_2a4 == acStack_b0[0xc]);
    auVar56[0xd] = -(cStack_2a3 == acStack_b0[0xd]);
    auVar56[0xe] = -(cStack_2a2 == acStack_b0[0xe]);
    auVar56[0xf] = -(cStack_2a1 == acStack_b0[0xf]);
    auVar20 = auVar20 & auVar56;
    if ((ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) | (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160843;
    puStack_2b8 = (undefined1 *)0x15e704;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e720;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x12) goto LAB_00160848;
    auVar21[0] = -(cStack_1a0 == 'm');
    auVar21[1] = -(cStack_19f == '\0');
    auVar21[2] = 0xff;
    auVar21[3] = 0xff;
    auVar21[4] = 0xff;
    auVar21[5] = 0xff;
    auVar21[6] = 0xff;
    auVar21[7] = 0xff;
    auVar21[8] = 0xff;
    auVar21[9] = 0xff;
    auVar21[10] = 0xff;
    auVar21[0xb] = 0xff;
    auVar21[0xc] = 0xff;
    auVar21[0xd] = 0xff;
    auVar21[0xe] = 0xff;
    auVar21[0xf] = 0xff;
    auVar57[0] = -(cStack_1b0 == acStack_b0[0]);
    auVar57[1] = -(cStack_1af == acStack_b0[1]);
    auVar57[2] = -(cStack_1ae == acStack_b0[2]);
    auVar57[3] = -(cStack_1ad == acStack_b0[3]);
    auVar57[4] = -(cStack_1ac == acStack_b0[4]);
    auVar57[5] = -(cStack_1ab == acStack_b0[5]);
    auVar57[6] = -(cStack_1aa == acStack_b0[6]);
    auVar57[7] = -(cStack_1a9 == acStack_b0[7]);
    auVar57[8] = -(cStack_1a8 == acStack_b0[8]);
    auVar57[9] = -(cStack_1a7 == acStack_b0[9]);
    auVar57[10] = -(cStack_1a6 == acStack_b0[10]);
    auVar57[0xb] = -(cStack_1a5 == acStack_b0[0xb]);
    auVar57[0xc] = -(cStack_1a4 == acStack_b0[0xc]);
    auVar57[0xd] = -(cStack_1a3 == acStack_b0[0xd]);
    auVar57[0xe] = -(cStack_1a2 == acStack_b0[0xe]);
    auVar57[0xf] = -(cStack_1a1 == acStack_b0[0xf]);
    auVar21 = auVar21 & auVar57;
    if ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) | (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016084d;
    puStack_2b8 = (undefined1 *)0x15e778;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160852;
    puStack_2b8 = (undefined1 *)0x15e792;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e7a6;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e7c4;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_18,run_test_idna_toascii::s_18 + 0xd,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x12) goto LAB_00160857;
    auVar22[0] = -(cStack_2a0 == 'm');
    auVar22[1] = -(cStack_29f == '\0');
    auVar22[2] = 0xff;
    auVar22[3] = 0xff;
    auVar22[4] = 0xff;
    auVar22[5] = 0xff;
    auVar22[6] = 0xff;
    auVar22[7] = 0xff;
    auVar22[8] = 0xff;
    auVar22[9] = 0xff;
    auVar22[10] = 0xff;
    auVar22[0xb] = 0xff;
    auVar22[0xc] = 0xff;
    auVar22[0xd] = 0xff;
    auVar22[0xe] = 0xff;
    auVar22[0xf] = 0xff;
    auVar58[0] = -(acStack_2b0[0] == acStack_b0[0]);
    auVar58[1] = -(acStack_2b0[1] == acStack_b0[1]);
    auVar58[2] = -(acStack_2b0[2] == acStack_b0[2]);
    auVar58[3] = -(acStack_2b0[3] == acStack_b0[3]);
    auVar58[4] = -(cStack_2ac == acStack_b0[4]);
    auVar58[5] = -(cStack_2ab == acStack_b0[5]);
    auVar58[6] = -(cStack_2aa == acStack_b0[6]);
    auVar58[7] = -(cStack_2a9 == acStack_b0[7]);
    auVar58[8] = -(cStack_2a8 == acStack_b0[8]);
    auVar58[9] = -(cStack_2a7 == acStack_b0[9]);
    auVar58[10] = -(cStack_2a6 == acStack_b0[10]);
    auVar58[0xb] = -(cStack_2a5 == acStack_b0[0xb]);
    auVar58[0xc] = -(cStack_2a4 == acStack_b0[0xc]);
    auVar58[0xd] = -(cStack_2a3 == acStack_b0[0xd]);
    auVar58[0xe] = -(cStack_2a2 == acStack_b0[0xe]);
    auVar58[0xf] = -(cStack_2a1 == acStack_b0[0xf]);
    auVar22 = auVar22 & auVar58;
    if ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) | (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016085c;
    puStack_2b8 = (undefined1 *)0x15e80b;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e827;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x12) goto LAB_00160861;
    auVar23[0] = -(cStack_1a0 == 'm');
    auVar23[1] = -(cStack_19f == '\0');
    auVar23[2] = 0xff;
    auVar23[3] = 0xff;
    auVar23[4] = 0xff;
    auVar23[5] = 0xff;
    auVar23[6] = 0xff;
    auVar23[7] = 0xff;
    auVar23[8] = 0xff;
    auVar23[9] = 0xff;
    auVar23[10] = 0xff;
    auVar23[0xb] = 0xff;
    auVar23[0xc] = 0xff;
    auVar23[0xd] = 0xff;
    auVar23[0xe] = 0xff;
    auVar23[0xf] = 0xff;
    auVar59[0] = -(cStack_1b0 == acStack_b0[0]);
    auVar59[1] = -(cStack_1af == acStack_b0[1]);
    auVar59[2] = -(cStack_1ae == acStack_b0[2]);
    auVar59[3] = -(cStack_1ad == acStack_b0[3]);
    auVar59[4] = -(cStack_1ac == acStack_b0[4]);
    auVar59[5] = -(cStack_1ab == acStack_b0[5]);
    auVar59[6] = -(cStack_1aa == acStack_b0[6]);
    auVar59[7] = -(cStack_1a9 == acStack_b0[7]);
    auVar59[8] = -(cStack_1a8 == acStack_b0[8]);
    auVar59[9] = -(cStack_1a7 == acStack_b0[9]);
    auVar59[10] = -(cStack_1a6 == acStack_b0[10]);
    auVar59[0xb] = -(cStack_1a5 == acStack_b0[0xb]);
    auVar59[0xc] = -(cStack_1a4 == acStack_b0[0xc]);
    auVar59[0xd] = -(cStack_1a3 == acStack_b0[0xd]);
    auVar59[0xe] = -(cStack_1a2 == acStack_b0[0xe]);
    auVar59[0xf] = -(cStack_1a1 == acStack_b0[0xf]);
    auVar23 = auVar23 & auVar59;
    if ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) | (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160866;
    puStack_2b8 = (undefined1 *)0x15e87f;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_0016086b;
    puStack_2b8 = (undefined1 *)0x15e899;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e8ad;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e8cb;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_19,run_test_idna_toascii::s_19 + 0xd,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x12) goto LAB_00160870;
    auVar24[0] = -(cStack_2a0 == 'm');
    auVar24[1] = -(cStack_29f == '\0');
    auVar24[2] = 0xff;
    auVar24[3] = 0xff;
    auVar24[4] = 0xff;
    auVar24[5] = 0xff;
    auVar24[6] = 0xff;
    auVar24[7] = 0xff;
    auVar24[8] = 0xff;
    auVar24[9] = 0xff;
    auVar24[10] = 0xff;
    auVar24[0xb] = 0xff;
    auVar24[0xc] = 0xff;
    auVar24[0xd] = 0xff;
    auVar24[0xe] = 0xff;
    auVar24[0xf] = 0xff;
    auVar60[0] = -(acStack_2b0[0] == acStack_b0[0]);
    auVar60[1] = -(acStack_2b0[1] == acStack_b0[1]);
    auVar60[2] = -(acStack_2b0[2] == acStack_b0[2]);
    auVar60[3] = -(acStack_2b0[3] == acStack_b0[3]);
    auVar60[4] = -(cStack_2ac == acStack_b0[4]);
    auVar60[5] = -(cStack_2ab == acStack_b0[5]);
    auVar60[6] = -(cStack_2aa == acStack_b0[6]);
    auVar60[7] = -(cStack_2a9 == acStack_b0[7]);
    auVar60[8] = -(cStack_2a8 == acStack_b0[8]);
    auVar60[9] = -(cStack_2a7 == acStack_b0[9]);
    auVar60[10] = -(cStack_2a6 == acStack_b0[10]);
    auVar60[0xb] = -(cStack_2a5 == acStack_b0[0xb]);
    auVar60[0xc] = -(cStack_2a4 == acStack_b0[0xc]);
    auVar60[0xd] = -(cStack_2a3 == acStack_b0[0xd]);
    auVar60[0xe] = -(cStack_2a2 == acStack_b0[0xe]);
    auVar60[0xf] = -(cStack_2a1 == acStack_b0[0xf]);
    auVar24 = auVar24 & auVar60;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160875;
    puStack_2b8 = (undefined1 *)0x15e912;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15e92e;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x12) goto LAB_0016087a;
    auVar25[0] = -(cStack_1a0 == 'm');
    auVar25[1] = -(cStack_19f == '\0');
    auVar25[2] = 0xff;
    auVar25[3] = 0xff;
    auVar25[4] = 0xff;
    auVar25[5] = 0xff;
    auVar25[6] = 0xff;
    auVar25[7] = 0xff;
    auVar25[8] = 0xff;
    auVar25[9] = 0xff;
    auVar25[10] = 0xff;
    auVar25[0xb] = 0xff;
    auVar25[0xc] = 0xff;
    auVar25[0xd] = 0xff;
    auVar25[0xe] = 0xff;
    auVar25[0xf] = 0xff;
    auVar61[0] = -(cStack_1b0 == acStack_b0[0]);
    auVar61[1] = -(cStack_1af == acStack_b0[1]);
    auVar61[2] = -(cStack_1ae == acStack_b0[2]);
    auVar61[3] = -(cStack_1ad == acStack_b0[3]);
    auVar61[4] = -(cStack_1ac == acStack_b0[4]);
    auVar61[5] = -(cStack_1ab == acStack_b0[5]);
    auVar61[6] = -(cStack_1aa == acStack_b0[6]);
    auVar61[7] = -(cStack_1a9 == acStack_b0[7]);
    auVar61[8] = -(cStack_1a8 == acStack_b0[8]);
    auVar61[9] = -(cStack_1a7 == acStack_b0[9]);
    auVar61[10] = -(cStack_1a6 == acStack_b0[10]);
    auVar61[0xb] = -(cStack_1a5 == acStack_b0[0xb]);
    auVar61[0xc] = -(cStack_1a4 == acStack_b0[0xc]);
    auVar61[0xd] = -(cStack_1a3 == acStack_b0[0xd]);
    auVar61[0xe] = -(cStack_1a2 == acStack_b0[0xe]);
    auVar61[0xf] = -(cStack_1a1 == acStack_b0[0xf]);
    auVar25 = auVar25 & auVar61;
    if ((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) | (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016087f;
    puStack_2b8 = (undefined1 *)0x15e986;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160884;
    puStack_2b8 = (undefined1 *)0x15e9a0;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e9b4;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15e9d2;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_20,run_test_idna_toascii::s_20 + 0xd,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x12) goto LAB_00160889;
    auVar26[0] = -(cStack_2a0 == 'm');
    auVar26[1] = -(cStack_29f == '\0');
    auVar26[2] = 0xff;
    auVar26[3] = 0xff;
    auVar26[4] = 0xff;
    auVar26[5] = 0xff;
    auVar26[6] = 0xff;
    auVar26[7] = 0xff;
    auVar26[8] = 0xff;
    auVar26[9] = 0xff;
    auVar26[10] = 0xff;
    auVar26[0xb] = 0xff;
    auVar26[0xc] = 0xff;
    auVar26[0xd] = 0xff;
    auVar26[0xe] = 0xff;
    auVar26[0xf] = 0xff;
    auVar62[0] = -(acStack_2b0[0] == acStack_b0[0]);
    auVar62[1] = -(acStack_2b0[1] == acStack_b0[1]);
    auVar62[2] = -(acStack_2b0[2] == acStack_b0[2]);
    auVar62[3] = -(acStack_2b0[3] == acStack_b0[3]);
    auVar62[4] = -(cStack_2ac == acStack_b0[4]);
    auVar62[5] = -(cStack_2ab == acStack_b0[5]);
    auVar62[6] = -(cStack_2aa == acStack_b0[6]);
    auVar62[7] = -(cStack_2a9 == acStack_b0[7]);
    auVar62[8] = -(cStack_2a8 == acStack_b0[8]);
    auVar62[9] = -(cStack_2a7 == acStack_b0[9]);
    auVar62[10] = -(cStack_2a6 == acStack_b0[10]);
    auVar62[0xb] = -(cStack_2a5 == acStack_b0[0xb]);
    auVar62[0xc] = -(cStack_2a4 == acStack_b0[0xc]);
    auVar62[0xd] = -(cStack_2a3 == acStack_b0[0xd]);
    auVar62[0xe] = -(cStack_2a2 == acStack_b0[0xe]);
    auVar62[0xf] = -(cStack_2a1 == acStack_b0[0xf]);
    auVar26 = auVar26 & auVar62;
    if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) | (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016088e;
    puStack_2b8 = (undefined1 *)0x15ea19;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ea35;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x12) goto LAB_00160893;
    auVar63[0] = -(acStack_b0[0] == cStack_1b0);
    auVar63[1] = -(acStack_b0[1] == cStack_1af);
    auVar63[2] = -(acStack_b0[2] == cStack_1ae);
    auVar63[3] = -(acStack_b0[3] == cStack_1ad);
    auVar63[4] = -(acStack_b0[4] == cStack_1ac);
    auVar63[5] = -(acStack_b0[5] == cStack_1ab);
    auVar63[6] = -(acStack_b0[6] == cStack_1aa);
    auVar63[7] = -(acStack_b0[7] == cStack_1a9);
    auVar63[8] = -(acStack_b0[8] == cStack_1a8);
    auVar63[9] = -(acStack_b0[9] == cStack_1a7);
    auVar63[10] = -(acStack_b0[10] == cStack_1a6);
    auVar63[0xb] = -(acStack_b0[0xb] == cStack_1a5);
    auVar63[0xc] = -(acStack_b0[0xc] == cStack_1a4);
    auVar63[0xd] = -(acStack_b0[0xd] == cStack_1a3);
    auVar63[0xe] = -(acStack_b0[0xe] == cStack_1a2);
    auVar63[0xf] = -(acStack_b0[0xf] == cStack_1a1);
    auVar27[0] = -(cStack_1a0 == 'm');
    auVar27[1] = -(cStack_19f == '\0');
    auVar27[2] = 0xff;
    auVar27[3] = 0xff;
    auVar27[4] = 0xff;
    auVar27[5] = 0xff;
    auVar27[6] = 0xff;
    auVar27[7] = 0xff;
    auVar27[8] = 0xff;
    auVar27[9] = 0xff;
    auVar27[10] = 0xff;
    auVar27[0xb] = 0xff;
    auVar27[0xc] = 0xff;
    auVar27[0xd] = 0xff;
    auVar27[0xe] = 0xff;
    auVar27[0xf] = 0xff;
    auVar27 = auVar27 & auVar63;
    if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) | (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160898;
    puStack_2b8 = (undefined1 *)0x15ea8d;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_0016089d;
    puStack_2b8 = (undefined1 *)0x15eaa7;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15eabb;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ead9;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_21,run_test_idna_toascii::s_21 + 2,acStack_2b0
                             ,&cStack_1b0);
    if (lVar5 != 8) goto LAB_001608a2;
    if (CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x6164742d2d6e78)
    goto LAB_001608a7;
    puStack_2b8 = (undefined1 *)0x15eb02;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15eb1e;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 8) goto LAB_001608ac;
    if (CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x6164742d2d6e78) goto LAB_001608b1;
    puStack_2b8 = (undefined1 *)0x15eb4b;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001608b6;
    puStack_2b8 = (undefined1 *)0x15eb65;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15eb79;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15eb97;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_22,run_test_idna_toascii::s_22 + 3,acStack_2b0
                             ,&cStack_1b0);
    if (lVar5 != 9) goto LAB_001608bb;
    if (cStack_2a8 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x6164742d2d6e782e)
    goto LAB_001608c0;
    puStack_2b8 = (undefined1 *)0x15ebcb;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ebe7;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 9) goto LAB_001608c5;
    if (cStack_1a8 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x6164742d2d6e782e) goto LAB_001608ca;
    puStack_2b8 = (undefined1 *)0x15ec1f;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001608cf;
    puStack_2b8 = (undefined1 *)0x15ec39;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ec4d;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ec6b;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_23,run_test_idna_toascii::s_23 + 5,acStack_2b0
                             ,&cStack_1b0);
    if (lVar5 != 0x10) goto LAB_001608d4;
    auVar28[0] = -(acStack_2b0[0] == 'x');
    auVar28[1] = -(acStack_2b0[1] == 'n');
    auVar28[2] = -(acStack_2b0[2] == '-');
    auVar28[3] = -(acStack_2b0[3] == '-');
    auVar28[4] = -(cStack_2ac == 't');
    auVar28[5] = -(cStack_2ab == 'd');
    auVar28[6] = -(cStack_2aa == 'a');
    auVar28[7] = -(cStack_2a9 == '.');
    auVar28[8] = -(cStack_2a8 == 'x');
    auVar28[9] = -(cStack_2a7 == 'n');
    auVar28[10] = -(cStack_2a6 == '-');
    auVar28[0xb] = -(cStack_2a5 == '-');
    auVar28[0xc] = -(cStack_2a4 == 't');
    auVar28[0xd] = -(cStack_2a3 == 'd');
    auVar28[0xe] = -(cStack_2a2 == 'a');
    auVar28[0xf] = -(cStack_2a1 == '\0');
    if ((ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) | (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe | (ushort)(auVar28[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_001608d9;
    puStack_2b8 = (undefined1 *)0x15ec9c;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ecb8;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x10) goto LAB_001608de;
    if (CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6164742d2d6e78 ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2e6164742d2d6e78) goto LAB_001608e3;
    puStack_2b8 = (undefined1 *)0x15ecfd;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001608e8;
    puStack_2b8 = (undefined1 *)0x15ed17;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ed2b;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ed49;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_24,run_test_idna_toascii::s_24 + 6,acStack_2b0
                             ,&cStack_1b0);
    if (lVar5 != 0x11) goto LAB_001608ed;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x2e6164742d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x2e6164742d2d6e78) goto LAB_001608f2;
    puStack_2b8 = (undefined1 *)0x15ed7e;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ed9a;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x11) goto LAB_001608f7;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x2e6164742d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x2e6164742d2d6e78) goto LAB_001608fc;
    puStack_2b8 = (undefined1 *)0x15ede0;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160901;
    puStack_2b8 = (undefined1 *)0x15edfa;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ee0e;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ee2c;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_25,run_test_idna_toascii::s_25 + 0xb,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x11) goto LAB_00160906;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x6e6163342d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x6239303032766138) goto LAB_0016090b;
    puStack_2b8 = (undefined1 *)0x15ee75;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ee91;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x11) goto LAB_00160910;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x6e6163342d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6239303032766138) goto LAB_00160915;
    puStack_2b8 = (undefined1 *)0x15eed4;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_0016091a;
    puStack_2b8 = (undefined1 *)0x15eeee;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ef02;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ef20;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_26,run_test_idna_toascii::s_26 + 0x44,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x4b) goto LAB_0016091f;
    puStack_2b8 = (undefined1 *)0x15ef3e;
    iVar4 = bcmp(acStack_2b0,
                 "xn--Willst du die Blthe des frhen, die Frchte des spteren Jahres-x9e96lkal",0x4b);
    if (iVar4 != 0) goto LAB_00160924;
    puStack_2b8 = (undefined1 *)0x15ef51;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15ef6d;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x4b) goto LAB_00160929;
    puStack_2b8 = (undefined1 *)0x15ef90;
    iVar4 = bcmp(&cStack_1b0,
                 "xn--Willst du die Blthe des frhen, die Frchte des spteren Jahres-x9e96lkal",0x4b);
    if (iVar4 != 0) goto LAB_0016092e;
    puStack_2b8 = (undefined1 *)0x15efad;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160933;
    puStack_2b8 = (undefined1 *)0x15efc7;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15efdb;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15eff9;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_27,run_test_idna_toascii::s_27 + 0x22,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x1b) goto LAB_00160938;
    auVar64[0] = -(cStack_2a5 == '6');
    auVar64[1] = -(cStack_2a4 == 'b');
    auVar64[2] = -(cStack_2a3 == 'u');
    auVar64[3] = -(cStack_2a2 == '4');
    auVar64[4] = -(cStack_2a1 == 'b');
    auVar64[5] = -(cStack_2a0 == 'x');
    auVar64[6] = -(cStack_29f == 'f');
    auVar64[7] = -(cStack_29e == 'g');
    auVar64[8] = -(cStack_29d == 'e');
    auVar64[9] = -(cStack_29c == 'h');
    auVar64[10] = -(cStack_29b == 'f');
    auVar64[0xb] = -(cStack_29a == 'v');
    auVar64[0xc] = -(cStack_299 == 'w');
    auVar64[0xd] = -(cStack_298 == 'x');
    auVar64[0xe] = -(cStack_297 == 'n');
    auVar64[0xf] = -(cStack_296 == '\0');
    auVar29[0] = -(acStack_2b0[0] == 'x');
    auVar29[1] = -(acStack_2b0[1] == 'n');
    auVar29[2] = -(acStack_2b0[2] == '-');
    auVar29[3] = -(acStack_2b0[3] == '-');
    auVar29[4] = -(cStack_2ac == 'e');
    auVar29[5] = -(cStack_2ab == 'g');
    auVar29[6] = -(cStack_2aa == 'b');
    auVar29[7] = -(cStack_2a9 == 'p');
    auVar29[8] = -(cStack_2a8 == 'd');
    auVar29[9] = -(cStack_2a7 == 'a');
    auVar29[10] = -(cStack_2a6 == 'j');
    auVar29[0xb] = -(cStack_2a5 == '6');
    auVar29[0xc] = -(cStack_2a4 == 'b');
    auVar29[0xd] = -(cStack_2a3 == 'u');
    auVar29[0xe] = -(cStack_2a2 == '4');
    auVar29[0xf] = -(cStack_2a1 == 'b');
    auVar29 = auVar29 & auVar64;
    if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) | (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar29[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016093d;
    puStack_2b8 = (undefined1 *)0x15f03c;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f058;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x1b) goto LAB_00160942;
    auVar30[0] = -(cStack_1b0 == 'x');
    auVar30[1] = -(cStack_1af == 'n');
    auVar30[2] = -(cStack_1ae == '-');
    auVar30[3] = -(cStack_1ad == '-');
    auVar30[4] = -(cStack_1ac == 'e');
    auVar30[5] = -(cStack_1ab == 'g');
    auVar30[6] = -(cStack_1aa == 'b');
    auVar30[7] = -(cStack_1a9 == 'p');
    auVar30[8] = -(cStack_1a8 == 'd');
    auVar30[9] = -(cStack_1a7 == 'a');
    auVar30[10] = -(cStack_1a6 == 'j');
    auVar30[0xb] = -(cStack_1a5 == '6');
    auVar30[0xc] = -(cStack_1a4 == 'b');
    auVar30[0xd] = -(cStack_1a3 == 'u');
    auVar30[0xe] = -(cStack_1a2 == '4');
    auVar30[0xf] = -(cStack_1a1 == 'b');
    auVar79[0] = -(cStack_1a5 == '6');
    auVar79[1] = -(cStack_1a4 == 'b');
    auVar79[2] = -(cStack_1a3 == 'u');
    auVar79[3] = -(cStack_1a2 == '4');
    auVar79[4] = -(cStack_1a1 == 'b');
    auVar79[5] = -(cStack_1a0 == 'x');
    auVar79[6] = -(cStack_19f == 'f');
    auVar79[7] = -(cStack_19e == 'g');
    auVar79[8] = -(cStack_19d == 'e');
    auVar79[9] = -(cStack_19c == 'h');
    auVar79[10] = -(cStack_19b == 'f');
    auVar79[0xb] = -(cStack_19a == 'v');
    auVar79[0xc] = -(cStack_199 == 'w');
    auVar79[0xd] = -(cStack_198 == 'x');
    auVar79[0xe] = -(cStack_197 == 'n');
    auVar79[0xf] = -(cStack_196 == '\0');
    auVar30 = auVar30 & auVar79;
    if ((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) | (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160947;
    puStack_2b8 = (undefined1 *)0x15f0e4;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_0016094c;
    puStack_2b8 = (undefined1 *)0x15f0fe;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f112;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f130;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_28,run_test_idna_toascii::s_28 + 0x1b,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x1d) goto LAB_00160951;
    auVar65[0] = -(cStack_2a3 == 'v');
    auVar65[1] = -(cStack_2a2 == '8');
    auVar65[2] = -(cStack_2a1 == 'a');
    auVar65[3] = -(cStack_2a0 == '8');
    auVar65[4] = -(cStack_29f == 'd');
    auVar65[5] = -(cStack_29e == 'q');
    auVar65[6] = -(cStack_29d == 'g');
    auVar65[7] = -(cStack_29c == '0');
    auVar65[8] = -(cStack_29b == '5');
    auVar65[9] = -(cStack_29a == '6');
    auVar65[10] = -(cStack_299 == 'p');
    auVar65[0xb] = -(cStack_298 == 'q');
    auVar65[0xc] = -(cStack_297 == 'j');
    auVar65[0xd] = -(cStack_296 == 'y');
    auVar65[0xe] = -(cStack_295 == 'e');
    auVar65[0xf] = -(cStack_294 == '\0');
    auVar31[0] = -(acStack_2b0[0] == 'x');
    auVar31[1] = -(acStack_2b0[1] == 'n');
    auVar31[2] = -(acStack_2b0[2] == '-');
    auVar31[3] = -(acStack_2b0[3] == '-');
    auVar31[4] = -(cStack_2ac == 'i');
    auVar31[5] = -(cStack_2ab == 'h');
    auVar31[6] = -(cStack_2aa == 'q');
    auVar31[7] = -(cStack_2a9 == 'w');
    auVar31[8] = -(cStack_2a8 == 'c');
    auVar31[9] = -(cStack_2a7 == 'r');
    auVar31[10] = -(cStack_2a6 == 'b');
    auVar31[0xb] = -(cStack_2a5 == '4');
    auVar31[0xc] = -(cStack_2a4 == 'c');
    auVar31[0xd] = -(cStack_2a3 == 'v');
    auVar31[0xe] = -(cStack_2a2 == '8');
    auVar31[0xf] = -(cStack_2a1 == 'a');
    auVar31 = auVar31 & auVar65;
    if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) | (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160956;
    puStack_2b8 = (undefined1 *)0x15f173;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f18f;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x1d) goto LAB_0016095b;
    builtin_strncpy(acStack_b0,"xn--ihqw",9);
    acStack_b0[9] = '\0';
    acStack_b0[10] = '\0';
    acStack_b0[0xb] = '\0';
    acStack_b0[0xc] = '\0';
    acStack_b0[0xd] = '\0';
    acStack_b0[0xe] = '\0';
    acStack_b0[0xf] = '\0';
    auVar66[0] = -(cStack_1b0 == 'x');
    auVar66[1] = -(cStack_1af == 'n');
    auVar66[2] = -(cStack_1ae == '-');
    auVar66[3] = -(cStack_1ad == '-');
    auVar66[4] = -(cStack_1ac == 'i');
    auVar66[5] = -(cStack_1ab == 'h');
    auVar66[6] = -(cStack_1aa == 'q');
    auVar66[7] = -(cStack_1a9 == 'w');
    auVar66[8] = -(cStack_1a8 == 'c');
    auVar66[9] = -(cStack_1a7 == 'r');
    auVar66[10] = -(cStack_1a6 == 'b');
    auVar66[0xb] = -(cStack_1a5 == '4');
    auVar66[0xc] = -(cStack_1a4 == 'c');
    auVar66[0xd] = -(cStack_1a3 == 'v');
    auVar66[0xe] = -(cStack_1a2 == '8');
    auVar66[0xf] = -(cStack_1a1 == 'a');
    auVar80[0] = -(cStack_1a3 == 'v');
    auVar80[1] = -(cStack_1a2 == '8');
    auVar80[2] = -(cStack_1a1 == 'a');
    auVar80[3] = -(cStack_1a0 == '8');
    auVar80[4] = -(cStack_19f == 'd');
    auVar80[5] = -(cStack_19e == 'q');
    auVar80[6] = -(cStack_19d == 'g');
    auVar80[7] = -(cStack_19c == '0');
    auVar80[8] = -(cStack_19b == '5');
    auVar80[9] = -(cStack_19a == '6');
    auVar80[10] = -(cStack_199 == 'p');
    auVar80[0xb] = -(cStack_198 == 'q');
    auVar80[0xc] = -(cStack_197 == 'j');
    auVar80[0xd] = -(cStack_196 == 'y');
    auVar80[0xe] = -(cStack_195 == 'e');
    auVar80[0xf] = -(cStack_194 == '\0');
    auVar66 = auVar66 & auVar80;
    if ((ushort)((ushort)(SUB161(auVar66 >> 7,0) & 1) | (ushort)(SUB161(auVar66 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar66 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar66 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar66 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar66 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar66 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar66 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar66 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar66 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar66 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar66 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar66 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar66 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar66 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar66[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160960;
    puStack_2b8 = (undefined1 *)0x15f224;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160965;
    puStack_2b8 = (undefined1 *)0x15f23e;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f252;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f270;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_29,run_test_idna_toascii::s_29 + 0x1b,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x20) goto LAB_0016096a;
    auVar67[0] = -(cStack_2a0 == '6');
    auVar67[1] = -(cStack_29f == '5');
    auVar67[2] = -(cStack_29e == '9');
    auVar67[3] = -(cStack_29d == 'd');
    auVar67[4] = -(cStack_29c == 'r');
    auVar67[5] = -(cStack_29b == 's');
    auVar67[6] = -(cStack_29a == 's');
    auVar67[7] = -(cStack_299 == '3');
    auVar67[8] = -(cStack_298 == 'x');
    auVar67[9] = -(cStack_297 == '8');
    auVar67[10] = -(cStack_296 == 'b');
    auVar67[0xb] = -(cStack_295 == 'o');
    auVar67[0xc] = -(cStack_294 == '0');
    auVar67[0xd] = -(cStack_293 == 'y');
    auVar67[0xe] = -(cStack_292 == 'b');
    auVar67[0xf] = -(cStack_291 == '\0');
    auVar32[0] = -(acStack_2b0[0] == 'x');
    auVar32[1] = -(acStack_2b0[1] == 'n');
    auVar32[2] = -(acStack_2b0[2] == '-');
    auVar32[3] = -(acStack_2b0[3] == '-');
    auVar32[4] = -(cStack_2ac == 'i');
    auVar32[5] = -(cStack_2ab == 'h');
    auVar32[6] = -(cStack_2aa == 'q');
    auVar32[7] = -(cStack_2a9 == 'w');
    auVar32[8] = -(cStack_2a8 == 'c');
    auVar32[9] = -(cStack_2a7 == 't');
    auVar32[10] = -(cStack_2a6 == 'v');
    auVar32[0xb] = -(cStack_2a5 == 'z');
    auVar32[0xc] = -(cStack_2a4 == 'c');
    auVar32[0xd] = -(cStack_2a3 == '9');
    auVar32[0xe] = -(cStack_2a2 == '1');
    auVar32[0xf] = -(cStack_2a1 == 'f');
    auVar32 = auVar32 & auVar67;
    if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0016096f;
    puStack_2b8 = (undefined1 *)0x15f2b3;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f2cf;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x20) goto LAB_00160974;
    auVar33[0] = -(cStack_1a0 == '6');
    auVar33[1] = -(cStack_19f == '5');
    auVar33[2] = -(cStack_19e == '9');
    auVar33[3] = -(cStack_19d == 'd');
    auVar33[4] = -(cStack_19c == 'r');
    auVar33[5] = -(cStack_19b == 's');
    auVar33[6] = -(cStack_19a == 's');
    auVar33[7] = -(cStack_199 == '3');
    auVar33[8] = -(cStack_198 == 'x');
    auVar33[9] = -(cStack_197 == '8');
    auVar33[10] = -(cStack_196 == 'b');
    auVar33[0xb] = -(cStack_195 == 'o');
    auVar33[0xc] = -(cStack_194 == '0');
    auVar33[0xd] = -(cStack_193 == 'y');
    auVar33[0xe] = -(cStack_192 == 'b');
    auVar33[0xf] = -(cStack_191 == '\0');
    auVar81[0] = -(acStack_b0[0] == cStack_1b0);
    auVar81[1] = -(acStack_b0[1] == cStack_1af);
    auVar81[2] = -(acStack_b0[2] == cStack_1ae);
    auVar81[3] = -(acStack_b0[3] == cStack_1ad);
    auVar81[4] = -(acStack_b0[4] == cStack_1ac);
    auVar81[5] = -(acStack_b0[5] == cStack_1ab);
    auVar81[6] = -(acStack_b0[6] == cStack_1aa);
    auVar81[7] = -(acStack_b0[7] == cStack_1a9);
    auVar81[8] = -(cStack_1a8 == 'c');
    auVar81[9] = -(cStack_1a7 == 't');
    auVar81[10] = -(cStack_1a6 == 'v');
    auVar81[0xb] = -(cStack_1a5 == 'z');
    auVar81[0xc] = -(cStack_1a4 == 'c');
    auVar81[0xd] = -(cStack_1a3 == '9');
    auVar81[0xe] = -(cStack_1a2 == '1');
    auVar81[0xf] = -(cStack_1a1 == 'f');
    auVar81 = auVar81 & auVar33;
    if ((ushort)((ushort)(SUB161(auVar81 >> 7,0) & 1) | (ushort)(SUB161(auVar81 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar81 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar81 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar81 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar81 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar81 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar81 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar81 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar81 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar81 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar81 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar81 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar81[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160979;
    puStack_2b8 = (undefined1 *)0x15f351;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_0016097e;
    puStack_2b8 = (undefined1 *)0x15f36b;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f37f;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f39d;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_30,run_test_idna_toascii::s_30 + 0x1a,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x23) goto LAB_00160983;
    puStack_2b8 = (undefined1 *)0x15f3bb;
    iVar4 = bcmp(acStack_2b0,"xn--Proprostnemluvesky-uyb24dma41a",0x23);
    if (iVar4 != 0) goto LAB_00160988;
    puStack_2b8 = (undefined1 *)0x15f3ce;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f3ea;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x23) goto LAB_0016098d;
    puStack_2b8 = (undefined1 *)0x15f40d;
    iVar4 = bcmp(&cStack_1b0,"xn--Proprostnemluvesky-uyb24dma41a",0x23);
    if (iVar4 != 0) goto LAB_00160992;
    puStack_2b8 = (undefined1 *)0x15f42a;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160997;
    puStack_2b8 = (undefined1 *)0x15f444;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f458;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f476;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_31,run_test_idna_toascii::s_31 + 0x2c,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x21) goto LAB_0016099c;
    puStack_2b8 = (undefined1 *)0x15f494;
    iVar4 = bcmp(acStack_2b0,"xn--4dbcagdahymbxekheh6e0a7fei0b",0x21);
    if (iVar4 != 0) goto LAB_001609a1;
    puStack_2b8 = (undefined1 *)0x15f4a7;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f4c3;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x21) goto LAB_001609a6;
    puStack_2b8 = (undefined1 *)0x15f4e6;
    iVar4 = bcmp(&cStack_1b0,"xn--4dbcagdahymbxekheh6e0a7fei0b",0x21);
    if (iVar4 != 0) goto LAB_001609ab;
    puStack_2b8 = (undefined1 *)0x15f503;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001609b0;
    puStack_2b8 = (undefined1 *)0x15f51d;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f531;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f54f;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_32,run_test_idna_toascii::s_32 + 0x5a,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x31) goto LAB_001609b5;
    puStack_2b8 = (undefined1 *)0x15f56d;
    iVar4 = bcmp(acStack_2b0,"xn--i1baa7eci9glrd9b2ae1bj0hfcgg6iyaf8o0a1dig0cd",0x31);
    if (iVar4 != 0) goto LAB_001609ba;
    puStack_2b8 = (undefined1 *)0x15f580;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f59c;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x31) goto LAB_001609bf;
    puStack_2b8 = (undefined1 *)0x15f5bf;
    iVar4 = bcmp(&cStack_1b0,"xn--i1baa7eci9glrd9b2ae1bj0hfcgg6iyaf8o0a1dig0cd",0x31);
    if (iVar4 != 0) goto LAB_001609c4;
    puStack_2b8 = (undefined1 *)0x15f5dc;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001609c9;
    puStack_2b8 = (undefined1 *)0x15f5f6;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f60a;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f628;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_33,run_test_idna_toascii::s_33 + 0x36,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x2b) goto LAB_001609ce;
    puStack_2b8 = (undefined1 *)0x15f646;
    iVar4 = bcmp(acStack_2b0,"xn--n8jok5ay5dzabd5bym9f0cm5685rrjetr6pdxa",0x2b);
    if (iVar4 != 0) goto LAB_001609d3;
    puStack_2b8 = (undefined1 *)0x15f659;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f675;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x2b) goto LAB_001609d8;
    puStack_2b8 = (undefined1 *)0x15f698;
    iVar4 = bcmp(&cStack_1b0,"xn--n8jok5ay5dzabd5bym9f0cm5685rrjetr6pdxa",0x2b);
    if (iVar4 != 0) goto LAB_001609dd;
    puStack_2b8 = (undefined1 *)0x15f6b5;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001609e2;
    puStack_2b8 = (undefined1 *)0x15f6cf;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f6e3;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f701;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_34,run_test_idna_toascii::s_34 + 0x48,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x4a) goto LAB_001609e7;
    puStack_2b8 = (undefined1 *)0x15f71f;
    iVar4 = bcmp(acStack_2b0,
                 "xn--989aomsvi5e83db1d2a355cv1e0vak1dwrv93d5xbh15a0dt30a5jpsd879ccm6fea98c",0x4a);
    if (iVar4 != 0) goto LAB_001609ec;
    puStack_2b8 = (undefined1 *)0x15f732;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f74e;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x4a) goto LAB_001609f1;
    puStack_2b8 = (undefined1 *)0x15f771;
    iVar4 = bcmp(&cStack_1b0,
                 "xn--989aomsvi5e83db1d2a355cv1e0vak1dwrv93d5xbh15a0dt30a5jpsd879ccm6fea98c",0x4a);
    if (iVar4 != 0) goto LAB_001609f6;
    puStack_2b8 = (undefined1 *)0x15f78e;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_001609fb;
    puStack_2b8 = (undefined1 *)0x15f7a8;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f7bc;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f7da;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_35,run_test_idna_toascii::s_35 + 0x38,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x25) goto LAB_00160a00;
    puStack_2b8 = (undefined1 *)0x15f7f8;
    iVar4 = bcmp(acStack_2b0,"xn--b1abfaaepdrnnbgefbadotcwatmq2g4l",0x25);
    if (iVar4 != 0) goto LAB_00160a05;
    puStack_2b8 = (undefined1 *)0x15f80b;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f827;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x25) goto LAB_00160a0a;
    puStack_2b8 = (undefined1 *)0x15f84a;
    iVar4 = bcmp(&cStack_1b0,"xn--b1abfaaepdrnnbgefbadotcwatmq2g4l",0x25);
    if (iVar4 != 0) goto LAB_00160a0f;
    puStack_2b8 = (undefined1 *)0x15f867;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160a14;
    puStack_2b8 = (undefined1 *)0x15f881;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f895;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f8b3;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_36,run_test_idna_toascii::s_36 + 0x2a,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x32) goto LAB_00160a19;
    puStack_2b8 = (undefined1 *)0x15f8d1;
    iVar4 = bcmp(acStack_2b0,"xn--PorqunopuedensimplementehablarenEspaol-fmd56a",0x32);
    if (iVar4 != 0) goto LAB_00160a1e;
    puStack_2b8 = (undefined1 *)0x15f8e4;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f900;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x32) goto LAB_00160a23;
    puStack_2b8 = (undefined1 *)0x15f923;
    iVar4 = bcmp(&cStack_1b0,"xn--PorqunopuedensimplementehablarenEspaol-fmd56a",0x32);
    if (iVar4 != 0) goto LAB_00160a28;
    puStack_2b8 = (undefined1 *)0x15f940;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160a2d;
    puStack_2b8 = (undefined1 *)0x15f95a;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f96e;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15f98c;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_37,run_test_idna_toascii::s_37 + 0x2d,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x31) goto LAB_00160a32;
    puStack_2b8 = (undefined1 *)0x15f9aa;
    iVar4 = bcmp(acStack_2b0,"xn--TisaohkhngthchnitingVit-kjcr8268qyxafd2f1b9g",0x31);
    if (iVar4 != 0) goto LAB_00160a37;
    puStack_2b8 = (undefined1 *)0x15f9bd;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15f9d9;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x31) goto LAB_00160a3c;
    puStack_2b8 = (undefined1 *)0x15f9fc;
    iVar4 = bcmp(&cStack_1b0,"xn--TisaohkhngthchnitingVit-kjcr8268qyxafd2f1b9g",0x31);
    if (iVar4 != 0) goto LAB_00160a41;
    puStack_2b8 = (undefined1 *)0x15fa19;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160a46;
    puStack_2b8 = (undefined1 *)0x15fa33;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fa47;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fa65;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_38,run_test_idna_toascii::s_38 + 0x14,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x1d) goto LAB_00160a4b;
    auVar68[0] = -(cStack_2a3 == '1');
    auVar68[1] = -(cStack_2a2 == '8');
    auVar68[2] = -(cStack_2a1 == '0');
    auVar68[3] = -(cStack_2a0 == 'e');
    auVar68[4] = -(cStack_29f == '5');
    auVar68[5] = -(cStack_29e == '7');
    auVar68[6] = -(cStack_29d == '5');
    auVar68[7] = -(cStack_29c == 'a');
    auVar68[8] = -(cStack_29b == '6');
    auVar68[9] = -(cStack_29a == '5');
    auVar68[10] = -(cStack_299 == 'l');
    auVar68[0xb] = -(cStack_298 == 's');
    auVar68[0xc] = -(cStack_297 == 'y');
    auVar68[0xd] = -(cStack_296 == '2');
    auVar68[0xe] = -(cStack_295 == 'b');
    auVar68[0xf] = -(cStack_294 == '\0');
    auVar34[0] = -(acStack_2b0[0] == 'x');
    auVar34[1] = -(acStack_2b0[1] == 'n');
    auVar34[2] = -(acStack_2b0[2] == '-');
    auVar34[3] = -(acStack_2b0[3] == '-');
    auVar34[4] = -(cStack_2ac == '3');
    auVar34[5] = -(cStack_2ab == 'B');
    auVar34[6] = -(cStack_2aa == '-');
    auVar34[7] = -(cStack_2a9 == 'w');
    auVar34[8] = -(cStack_2a8 == 'w');
    auVar34[9] = -(cStack_2a7 == '4');
    auVar34[10] = -(cStack_2a6 == 'c');
    auVar34[0xb] = -(cStack_2a5 == '5');
    auVar34[0xc] = -(cStack_2a4 == 'e');
    auVar34[0xd] = -(cStack_2a3 == '1');
    auVar34[0xe] = -(cStack_2a2 == '8');
    auVar34[0xf] = -(cStack_2a1 == '0');
    auVar34 = auVar34 & auVar68;
    if ((ushort)((ushort)(SUB161(auVar34 >> 7,0) & 1) | (ushort)(SUB161(auVar34 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar34 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar34 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar34 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar34 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar34 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar34 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar34 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar34 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar34 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar34 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar34 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar34 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar34 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar34[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160a50;
    puStack_2b8 = (undefined1 *)0x15faa8;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15fac4;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x1d) goto LAB_00160a55;
    auVar35[0] = -(cStack_1b0 == 'x');
    auVar35[1] = -(cStack_1af == 'n');
    auVar35[2] = -(cStack_1ae == '-');
    auVar35[3] = -(cStack_1ad == '-');
    auVar35[4] = -(cStack_1ac == '3');
    auVar35[5] = -(cStack_1ab == 'B');
    auVar35[6] = -(cStack_1aa == '-');
    auVar35[7] = -(cStack_1a9 == 'w');
    auVar35[8] = -(cStack_1a8 == 'w');
    auVar35[9] = -(cStack_1a7 == '4');
    auVar35[10] = -(cStack_1a6 == 'c');
    auVar35[0xb] = -(cStack_1a5 == '5');
    auVar35[0xc] = -(cStack_1a4 == 'e');
    auVar35[0xd] = -(cStack_1a3 == '1');
    auVar35[0xe] = -(cStack_1a2 == '8');
    auVar35[0xf] = -(cStack_1a1 == '0');
    auVar82[0] = -(cStack_1a3 == '1');
    auVar82[1] = -(cStack_1a2 == '8');
    auVar82[2] = -(cStack_1a1 == '0');
    auVar82[3] = -(cStack_1a0 == 'e');
    auVar82[4] = -(cStack_19f == '5');
    auVar82[5] = -(cStack_19e == '7');
    auVar82[6] = -(cStack_19d == '5');
    auVar82[7] = -(cStack_19c == 'a');
    auVar82[8] = -(cStack_19b == '6');
    auVar82[9] = -(cStack_19a == '5');
    auVar82[10] = -(cStack_199 == 'l');
    auVar82[0xb] = -(cStack_198 == 's');
    auVar82[0xc] = -(cStack_197 == 'y');
    auVar82[0xd] = -(cStack_196 == '2');
    auVar82[0xe] = -(cStack_195 == 'b');
    auVar82[0xf] = -(cStack_194 == '\0');
    auVar35 = auVar35 & auVar82;
    if ((ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) | (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar35[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160a5a;
    puStack_2b8 = (undefined1 *)0x15fb50;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160a5f;
    puStack_2b8 = (undefined1 *)0x15fb6a;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fb7e;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fb9c;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_39,run_test_idna_toascii::s_39 + 0x22,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x2d) goto LAB_00160a64;
    puStack_2b8 = (undefined1 *)0x15fbba;
    iVar4 = bcmp(acStack_2b0,"xn---with-SUPER-MONKEYS-pc58ag80a8qai00g7n9n",0x2d);
    if (iVar4 != 0) goto LAB_00160a69;
    puStack_2b8 = (undefined1 *)0x15fbcd;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15fbe9;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x2d) goto LAB_00160a6e;
    puStack_2b8 = (undefined1 *)0x15fc0c;
    iVar4 = bcmp(&cStack_1b0,"xn---with-SUPER-MONKEYS-pc58ag80a8qai00g7n9n",0x2d);
    if (iVar4 != 0) goto LAB_00160a73;
    puStack_2b8 = (undefined1 *)0x15fc29;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160a78;
    puStack_2b8 = (undefined1 *)0x15fc43;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fc57;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fc75;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_40,run_test_idna_toascii::s_40 + 0x27,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x2d) goto LAB_00160a7d;
    puStack_2b8 = (undefined1 *)0x15fc93;
    iVar4 = bcmp(acStack_2b0,"xn--Hello-Another-Way--fc4qua05auwb3674vfr0b",0x2d);
    if (iVar4 != 0) goto LAB_00160a82;
    puStack_2b8 = (undefined1 *)0x15fca6;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15fcc2;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x2d) goto LAB_00160a87;
    puStack_2b8 = (undefined1 *)0x15fce5;
    iVar4 = bcmp(&cStack_1b0,"xn--Hello-Another-Way--fc4qua05auwb3674vfr0b",0x2d);
    if (iVar4 != 0) goto LAB_00160a8c;
    puStack_2b8 = (undefined1 *)0x15fd02;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160a91;
    puStack_2b8 = (undefined1 *)0x15fd1c;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fd30;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fd4e;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_41,run_test_idna_toascii::s_41 + 0x16,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x18) goto LAB_00160a96;
    auVar69[0] = -(cStack_2a0 == 'b');
    auVar69[1] = -(cStack_29f == 't');
    auVar69[2] = -(cStack_29e == '3');
    auVar69[3] = -(cStack_29d == 'u');
    auVar69[4] = -(cStack_29c == 'c');
    auVar69[5] = -(cStack_29b == '0');
    auVar69[6] = -(cStack_29a == 'v');
    auVar69[7] = -(cStack_299 == '\0');
    auVar69[8] = 0xff;
    auVar69[9] = 0xff;
    auVar69[10] = 0xff;
    auVar69[0xb] = 0xff;
    auVar69[0xc] = 0xff;
    auVar69[0xd] = 0xff;
    auVar69[0xe] = 0xff;
    auVar69[0xf] = 0xff;
    auVar36[0] = -(acStack_2b0[0] == 'x');
    auVar36[1] = -(acStack_2b0[1] == 'n');
    auVar36[2] = -(acStack_2b0[2] == '-');
    auVar36[3] = -(acStack_2b0[3] == '-');
    auVar36[4] = -(cStack_2ac == '2');
    auVar36[5] = -(cStack_2ab == '-');
    auVar36[6] = -(cStack_2aa == 'u');
    auVar36[7] = -(cStack_2a9 == '9');
    auVar36[8] = -(cStack_2a8 == 't');
    auVar36[9] = -(cStack_2a7 == 'l');
    auVar36[10] = -(cStack_2a6 == 'z');
    auVar36[0xb] = -(cStack_2a5 == 'r');
    auVar36[0xc] = -(cStack_2a4 == '9');
    auVar36[0xd] = -(cStack_2a3 == '7');
    auVar36[0xe] = -(cStack_2a2 == '5');
    auVar36[0xf] = -(cStack_2a1 == '6');
    auVar36 = auVar36 & auVar69;
    if ((ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) | (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar36[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160a9b;
    puStack_2b8 = (undefined1 *)0x15fd91;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15fdad;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x18) goto LAB_00160aa0;
    auVar37[0] = -(cStack_1b0 == 'x');
    auVar37[1] = -(cStack_1af == 'n');
    auVar37[2] = -(cStack_1ae == '-');
    auVar37[3] = -(cStack_1ad == '-');
    auVar37[4] = -(cStack_1ac == '2');
    auVar37[5] = -(cStack_1ab == '-');
    auVar37[6] = -(cStack_1aa == 'u');
    auVar37[7] = -(cStack_1a9 == '9');
    auVar37[8] = -(cStack_1a8 == 't');
    auVar37[9] = -(cStack_1a7 == 'l');
    auVar37[10] = -(cStack_1a6 == 'z');
    auVar37[0xb] = -(cStack_1a5 == 'r');
    auVar37[0xc] = -(cStack_1a4 == '9');
    auVar37[0xd] = -(cStack_1a3 == '7');
    auVar37[0xe] = -(cStack_1a2 == '5');
    auVar37[0xf] = -(cStack_1a1 == '6');
    auVar70[0] = -(cStack_1a0 == 'b');
    auVar70[1] = -(cStack_19f == 't');
    auVar70[2] = -(cStack_19e == '3');
    auVar70[3] = -(cStack_19d == 'u');
    auVar70[4] = -(cStack_19c == 'c');
    auVar70[5] = -(cStack_19b == '0');
    auVar70[6] = -(cStack_19a == 'v');
    auVar70[7] = -(cStack_199 == '\0');
    auVar70[8] = 0xff;
    auVar70[9] = 0xff;
    auVar70[10] = 0xff;
    auVar70[0xb] = 0xff;
    auVar70[0xc] = 0xff;
    auVar70[0xd] = 0xff;
    auVar70[0xe] = 0xff;
    auVar70[0xf] = 0xff;
    auVar70 = auVar70 & auVar37;
    if ((ushort)((ushort)(SUB161(auVar70 >> 7,0) & 1) | (ushort)(SUB161(auVar70 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar70 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar70 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar70 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar70 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar70 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar70 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar70 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar70 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar70 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar70 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar70 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar70 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar70 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar70[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160aa5;
    puStack_2b8 = (undefined1 *)0x15fe1b;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160aaa;
    puStack_2b8 = (undefined1 *)0x15fe35;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fe49;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15fe67;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_42,run_test_idna_toascii::s_42 + 0x17,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x1f) goto LAB_00160aaf;
    auVar71[0] = -(cStack_2a1 == '3');
    auVar71[1] = -(cStack_2a0 == 'g');
    auVar71[2] = -(cStack_29f == 'u');
    auVar71[3] = -(cStack_29e == 'e');
    auVar71[4] = -(cStack_29d == '6');
    auVar71[5] = -(cStack_29c == 'q');
    auVar71[6] = -(cStack_29b == 'z');
    auVar71[7] = -(cStack_29a == '0');
    auVar71[8] = -(cStack_299 == '7');
    auVar71[9] = -(cStack_298 == '5');
    auVar71[10] = -(cStack_297 == 'a');
    auVar71[0xb] = -(cStack_296 == 'z');
    auVar71[0xc] = -(cStack_295 == 'm');
    auVar71[0xd] = -(cStack_294 == '5');
    auVar71[0xe] = -(cStack_293 == 'e');
    auVar71[0xf] = -(cStack_292 == '\0');
    auVar38[0] = -(acStack_2b0[0] == 'x');
    auVar38[1] = -(acStack_2b0[1] == 'n');
    auVar38[2] = -(acStack_2b0[2] == '-');
    auVar38[3] = -(acStack_2b0[3] == '-');
    auVar38[4] = -(cStack_2ac == 'M');
    auVar38[5] = -(cStack_2ab == 'a');
    auVar38[6] = -(cStack_2aa == 'j');
    auVar38[7] = -(cStack_2a9 == 'i');
    auVar38[8] = -(cStack_2a8 == 'K');
    auVar38[9] = -(cStack_2a7 == 'o');
    auVar38[10] = -(cStack_2a6 == 'i');
    auVar38[0xb] = -(cStack_2a5 == '5');
    auVar38[0xc] = -(cStack_2a4 == '-');
    auVar38[0xd] = -(cStack_2a3 == '7');
    auVar38[0xe] = -(cStack_2a2 == '8');
    auVar38[0xf] = -(cStack_2a1 == '3');
    auVar38 = auVar38 & auVar71;
    if ((ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) | (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar38[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160ab4;
    puStack_2b8 = (undefined1 *)0x15feaa;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15fec6;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x1f) goto LAB_00160ab9;
    auVar39[0] = -(cStack_1b0 == 'x');
    auVar39[1] = -(cStack_1af == 'n');
    auVar39[2] = -(cStack_1ae == '-');
    auVar39[3] = -(cStack_1ad == '-');
    auVar39[4] = -(cStack_1ac == 'M');
    auVar39[5] = -(cStack_1ab == 'a');
    auVar39[6] = -(cStack_1aa == 'j');
    auVar39[7] = -(cStack_1a9 == 'i');
    auVar39[8] = -(cStack_1a8 == 'K');
    auVar39[9] = -(cStack_1a7 == 'o');
    auVar39[10] = -(cStack_1a6 == 'i');
    auVar39[0xb] = -(cStack_1a5 == '5');
    auVar39[0xc] = -(cStack_1a4 == '-');
    auVar39[0xd] = -(cStack_1a3 == '7');
    auVar39[0xe] = -(cStack_1a2 == '8');
    auVar39[0xf] = -(cStack_1a1 == '3');
    auVar83[0] = -(cStack_1a1 == '3');
    auVar83[1] = -(cStack_1a0 == 'g');
    auVar83[2] = -(cStack_19f == 'u');
    auVar83[3] = -(cStack_19e == 'e');
    auVar83[4] = -(cStack_19d == '6');
    auVar83[5] = -(cStack_19c == 'q');
    auVar83[6] = -(cStack_19b == 'z');
    auVar83[7] = -(cStack_19a == '0');
    auVar83[8] = -(cStack_199 == '7');
    auVar83[9] = -(cStack_198 == '5');
    auVar83[10] = -(cStack_197 == 'a');
    auVar83[0xb] = -(cStack_196 == 'z');
    auVar83[0xc] = -(cStack_195 == 'm');
    auVar83[0xd] = -(cStack_194 == '5');
    auVar83[0xe] = -(cStack_193 == 'e');
    auVar83[0xf] = -(cStack_192 == '\0');
    auVar39 = auVar39 & auVar83;
    if ((ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) | (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar39[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160abe;
    puStack_2b8 = (undefined1 *)0x15ff52;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160ac3;
    puStack_2b8 = (undefined1 *)0x15ff6c;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ff80;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x15ff9e;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_43,run_test_idna_toascii::s_43 + 0x17,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x16) goto LAB_00160ac8;
    auVar72[0] = -(cStack_2aa == '-');
    auVar72[1] = -(cStack_2a9 == 'j');
    auVar72[2] = -(cStack_2a8 == 'g');
    auVar72[3] = -(cStack_2a7 == '4');
    auVar72[4] = -(cStack_2a6 == 'a');
    auVar72[5] = -(cStack_2a5 == 'v');
    auVar72[6] = -(cStack_2a4 == 'h');
    auVar72[7] = -(cStack_2a3 == 'b');
    auVar72[8] = -(cStack_2a2 == 'y');
    auVar72[9] = -(cStack_2a1 == '1');
    auVar72[10] = -(cStack_2a0 == 'n');
    auVar72[0xb] = -(cStack_29f == 'o');
    auVar72[0xc] = -(cStack_29e == 'c');
    auVar72[0xd] = -(cStack_29d == '0');
    auVar72[0xe] = -(cStack_29c == 'd');
    auVar72[0xf] = -(cStack_29b == '\0');
    auVar40[0] = -(acStack_2b0[0] == 'x');
    auVar40[1] = -(acStack_2b0[1] == 'n');
    auVar40[2] = -(acStack_2b0[2] == '-');
    auVar40[3] = -(acStack_2b0[3] == '-');
    auVar40[4] = -(cStack_2ac == 'd');
    auVar40[5] = -(cStack_2ab == 'e');
    auVar40[6] = -(cStack_2aa == '-');
    auVar40[7] = -(cStack_2a9 == 'j');
    auVar40[8] = -(cStack_2a8 == 'g');
    auVar40[9] = -(cStack_2a7 == '4');
    auVar40[10] = -(cStack_2a6 == 'a');
    auVar40[0xb] = -(cStack_2a5 == 'v');
    auVar40[0xc] = -(cStack_2a4 == 'h');
    auVar40[0xd] = -(cStack_2a3 == 'b');
    auVar40[0xe] = -(cStack_2a2 == 'y');
    auVar40[0xf] = -(cStack_2a1 == '1');
    auVar40 = auVar40 & auVar72;
    if ((ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) | (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar40[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160acd;
    puStack_2b8 = (undefined1 *)0x15ffe1;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x15fffd;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x16) goto LAB_00160ad2;
    auVar41[0] = -(cStack_1b0 == 'x');
    auVar41[1] = -(cStack_1af == 'n');
    auVar41[2] = -(cStack_1ae == '-');
    auVar41[3] = -(cStack_1ad == '-');
    auVar41[4] = -(cStack_1ac == 'd');
    auVar41[5] = -(cStack_1ab == 'e');
    auVar41[6] = -(cStack_1aa == '-');
    auVar41[7] = -(cStack_1a9 == 'j');
    auVar41[8] = -(cStack_1a8 == 'g');
    auVar41[9] = -(cStack_1a7 == '4');
    auVar41[10] = -(cStack_1a6 == 'a');
    auVar41[0xb] = -(cStack_1a5 == 'v');
    auVar41[0xc] = -(cStack_1a4 == 'h');
    auVar41[0xd] = -(cStack_1a3 == 'b');
    auVar41[0xe] = -(cStack_1a2 == 'y');
    auVar41[0xf] = -(cStack_1a1 == '1');
    auVar84[0] = -(cStack_1aa == '-');
    auVar84[1] = -(cStack_1a9 == 'j');
    auVar84[2] = -(cStack_1a8 == 'g');
    auVar84[3] = -(cStack_1a7 == '4');
    auVar84[4] = -(cStack_1a6 == 'a');
    auVar84[5] = -(cStack_1a5 == 'v');
    auVar84[6] = -(cStack_1a4 == 'h');
    auVar84[7] = -(cStack_1a3 == 'b');
    auVar84[8] = -(cStack_1a2 == 'y');
    auVar84[9] = -(cStack_1a1 == '1');
    auVar84[10] = -(cStack_1a0 == 'n');
    auVar84[0xb] = -(cStack_19f == 'o');
    auVar84[0xc] = -(cStack_19e == 'c');
    auVar84[0xd] = -(cStack_19d == '0');
    auVar84[0xe] = -(cStack_19c == 'd');
    auVar84[0xf] = -(cStack_19b == '\0');
    auVar41 = auVar41 & auVar84;
    if ((ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) | (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar41[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160ad7;
    puStack_2b8 = (undefined1 *)0x160089;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160adc;
    puStack_2b8 = (undefined1 *)0x1600a3;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1600b7;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1600d5;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_44,run_test_idna_toascii::s_44 + 0x15,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x14) goto LAB_00160ae1;
    auVar73[0] = -(cStack_2a0 == 'c');
    auVar73[1] = -(cStack_29f == 'z');
    auVar73[2] = -(cStack_29e == 'p');
    auVar73[3] = -(cStack_29d == '\0');
    auVar73[4] = 0xff;
    auVar73[5] = 0xff;
    auVar73[6] = 0xff;
    auVar73[7] = 0xff;
    auVar73[8] = 0xff;
    auVar73[9] = 0xff;
    auVar73[10] = 0xff;
    auVar73[0xb] = 0xff;
    auVar73[0xc] = 0xff;
    auVar73[0xd] = 0xff;
    auVar73[0xe] = 0xff;
    auVar73[0xf] = 0xff;
    auVar42[0] = -(acStack_2b0[0] == 'x');
    auVar42[1] = -(acStack_2b0[1] == 'n');
    auVar42[2] = -(acStack_2b0[2] == '-');
    auVar42[3] = -(acStack_2b0[3] == '-');
    auVar42[4] = -(cStack_2ac == 'd');
    auVar42[5] = -(cStack_2ab == '9');
    auVar42[6] = -(cStack_2aa == 'j');
    auVar42[7] = -(cStack_2a9 == 'u');
    auVar42[8] = -(cStack_2a8 == 'a');
    auVar42[9] = -(cStack_2a7 == 'u');
    auVar42[10] = -(cStack_2a6 == '4');
    auVar42[0xb] = -(cStack_2a5 == '1');
    auVar42[0xc] = -(cStack_2a4 == 'a');
    auVar42[0xd] = -(cStack_2a3 == 'w');
    auVar42[0xe] = -(cStack_2a2 == 'c');
    auVar42[0xf] = -(cStack_2a1 == 'z');
    auVar42 = auVar42 & auVar73;
    if ((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) | (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar42[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160ae6;
    puStack_2b8 = (undefined1 *)0x160118;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x160134;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x14) goto LAB_00160aeb;
    auVar43[0] = -(cStack_1b0 == 'x');
    auVar43[1] = -(cStack_1af == 'n');
    auVar43[2] = -(cStack_1ae == '-');
    auVar43[3] = -(cStack_1ad == '-');
    auVar43[4] = -(cStack_1ac == 'd');
    auVar43[5] = -(cStack_1ab == '9');
    auVar43[6] = -(cStack_1aa == 'j');
    auVar43[7] = -(cStack_1a9 == 'u');
    auVar43[8] = -(cStack_1a8 == 'a');
    auVar43[9] = -(cStack_1a7 == 'u');
    auVar43[10] = -(cStack_1a6 == '4');
    auVar43[0xb] = -(cStack_1a5 == '1');
    auVar43[0xc] = -(cStack_1a4 == 'a');
    auVar43[0xd] = -(cStack_1a3 == 'w');
    auVar43[0xe] = -(cStack_1a2 == 'c');
    auVar43[0xf] = -(cStack_1a1 == 'z');
    auVar74[0] = -(cStack_1a0 == 'c');
    auVar74[1] = -(cStack_19f == 'z');
    auVar74[2] = -(cStack_19e == 'p');
    auVar74[3] = -(cStack_19d == '\0');
    auVar74[4] = 0xff;
    auVar74[5] = 0xff;
    auVar74[6] = 0xff;
    auVar74[7] = 0xff;
    auVar74[8] = 0xff;
    auVar74[9] = 0xff;
    auVar74[10] = 0xff;
    auVar74[0xb] = 0xff;
    auVar74[0xc] = 0xff;
    auVar74[0xd] = 0xff;
    auVar74[0xe] = 0xff;
    auVar74[0xf] = 0xff;
    auVar74 = auVar74 & auVar43;
    if ((ushort)((ushort)(SUB161(auVar74 >> 7,0) & 1) | (ushort)(SUB161(auVar74 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar74 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar74 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar74 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar74 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar74 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar74 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar74 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar74 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar74 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar74 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar74 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar74 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar74 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar74[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160af0;
    puStack_2b8 = (undefined1 *)0x1601a2;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160af5;
    puStack_2b8 = (undefined1 *)0x1601bc;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1601d0;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1601ee;
    lVar5 = uv__idna_toascii("-> $1.00 <-","",acStack_2b0,&cStack_1b0);
    if (lVar5 != 0xc) goto LAB_00160afa;
    if (CONCAT13(cStack_2a5,CONCAT12(cStack_2a6,CONCAT11(cStack_2a7,cStack_2a8))) != 0x2d3c20 ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x30302e3124203e2d)
    goto LAB_00160aff;
    puStack_2b8 = (undefined1 *)0x160228;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x160244;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0xc) goto LAB_00160b04;
    if (CONCAT13(cStack_1a5,CONCAT12(cStack_1a6,CONCAT11(cStack_1a7,cStack_1a8))) != 0x2d3c20 ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x30302e3124203e2d) goto LAB_00160b09;
    puStack_2b8 = (undefined1 *)0x160281;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160b0e;
    puStack_2b8 = (undefined1 *)0x16029b;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1602af;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1602cd;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_46,run_test_idna_toascii::s_46 + 7,acStack_2b0
                             ,&cStack_1b0);
    if (lVar5 != 0xe) goto LAB_00160b13;
    if (CONCAT17(cStack_2a3,
                 CONCAT16(cStack_2a4,
                          CONCAT15(cStack_2a5,
                                   CONCAT14(cStack_2a6,
                                            CONCAT13(cStack_2a7,
                                                     CONCAT12(cStack_2a8,
                                                              CONCAT11(cStack_2a9,cStack_2aa)))))))
        != 0x65642e6169682d ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x682d61662d2d6e78)
    goto LAB_00160b18;
    puStack_2b8 = (undefined1 *)0x16030e;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x16032a;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0xe) goto LAB_00160b1d;
    if (CONCAT17(cStack_1a3,
                 CONCAT16(cStack_1a4,
                          CONCAT15(cStack_1a5,
                                   CONCAT14(cStack_1a6,
                                            CONCAT13(cStack_1a7,
                                                     CONCAT12(cStack_1a8,
                                                              CONCAT11(cStack_1a9,cStack_1aa)))))))
        != 0x65642e6169682d ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x682d61662d2d6e78) goto LAB_00160b22;
    puStack_2b8 = (undefined1 *)0x160362;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160b27;
    puStack_2b8 = (undefined1 *)0x16037c;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x160390;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1603ae;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_47,run_test_idna_toascii::s_47 + 0xe,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x11) goto LAB_00160b2c;
    if ((cStack_2a0 != '\0' ||
        CONCAT17(cStack_2a9,
                 CONCAT16(cStack_2aa,
                          CONCAT15(cStack_2ab,
                                   CONCAT14(cStack_2ac,
                                            CONCAT13(acStack_2b0[3],
                                                     CONCAT12(acStack_2b0[2],
                                                              CONCAT11(acStack_2b0[1],acStack_2b0[0]
                                                                      ))))))) != 0x7361786e2d2d6e78)
        || CONCAT17(cStack_2a1,
                    CONCAT16(cStack_2a2,
                             CONCAT15(cStack_2a3,
                                      CONCAT14(cStack_2a4,
                                               CONCAT13(cStack_2a5,
                                                        CONCAT12(cStack_2a6,
                                                                 CONCAT11(cStack_2a7,cStack_2a8)))))
                            )) != 0x6d6f632e63316d6d) goto LAB_00160b31;
    puStack_2b8 = (undefined1 *)0x1603f7;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x160413;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x11) goto LAB_00160b36;
    if ((cStack_1a0 != '\0' ||
        CONCAT17(cStack_1a9,
                 CONCAT16(cStack_1aa,
                          CONCAT15(cStack_1ab,
                                   CONCAT14(cStack_1ac,
                                            CONCAT13(cStack_1ad,
                                                     CONCAT12(cStack_1ae,
                                                              CONCAT11(cStack_1af,cStack_1b0)))))))
        != 0x7361786e2d2d6e78) ||
        CONCAT17(cStack_1a1,
                 CONCAT16(cStack_1a2,
                          CONCAT15(cStack_1a3,
                                   CONCAT14(cStack_1a4,
                                            CONCAT13(cStack_1a5,
                                                     CONCAT12(cStack_1a6,
                                                              CONCAT11(cStack_1a7,cStack_1a8)))))))
        != 0x6d6f632e63316d6d) goto LAB_00160b3b;
    puStack_2b8 = (undefined1 *)0x160456;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160b40;
    puStack_2b8 = (undefined1 *)0x160470;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x160484;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1604a2;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_48,run_test_idna_toascii::s_48 + 0x13,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x15) goto LAB_00160b45;
    auVar75[0] = -(cStack_2ab == '0');
    auVar75[1] = -(cStack_2aa == 'c');
    auVar75[2] = -(cStack_2a9 == 'l');
    auVar75[3] = -(cStack_2a8 == '1');
    auVar75[4] = -(cStack_2a7 == 'a');
    auVar75[5] = -(cStack_2a6 == '0');
    auVar75[6] = -(cStack_2a5 == 'b');
    auVar75[7] = -(cStack_2a4 == '6');
    auVar75[8] = -(cStack_2a3 == '6');
    auVar75[9] = -(cStack_2a2 == '0');
    auVar75[10] = -(cStack_2a1 == 'p');
    auVar75[0xb] = -(cStack_2a0 == '.');
    auVar75[0xc] = -(cStack_29f == 'c');
    auVar75[0xd] = -(cStack_29e == 'o');
    auVar75[0xe] = -(cStack_29d == 'm');
    auVar75[0xf] = -(cStack_29c == '\0');
    auVar44[0] = -(acStack_2b0[0] == 'x');
    auVar44[1] = -(acStack_2b0[1] == 'n');
    auVar44[2] = -(acStack_2b0[2] == '-');
    auVar44[3] = -(acStack_2b0[3] == '-');
    auVar44[4] = -(cStack_2ac == '1');
    auVar44[5] = -(cStack_2ab == '0');
    auVar44[6] = -(cStack_2aa == 'c');
    auVar44[7] = -(cStack_2a9 == 'l');
    auVar44[8] = -(cStack_2a8 == '1');
    auVar44[9] = -(cStack_2a7 == 'a');
    auVar44[10] = -(cStack_2a6 == '0');
    auVar44[0xb] = -(cStack_2a5 == 'b');
    auVar44[0xc] = -(cStack_2a4 == '6');
    auVar44[0xd] = -(cStack_2a3 == '6');
    auVar44[0xe] = -(cStack_2a2 == '0');
    auVar44[0xf] = -(cStack_2a1 == 'p');
    auVar44 = auVar44 & auVar75;
    if ((ushort)((ushort)(SUB161(auVar44 >> 7,0) & 1) | (ushort)(SUB161(auVar44 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar44 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar44 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar44 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar44 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar44 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar44 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar44 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar44 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar44 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar44 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar44 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar44[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160b4a;
    puStack_2b8 = (undefined1 *)0x1604e5;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x160501;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x15) goto LAB_00160b4f;
    auVar45[0] = -(cStack_1b0 == 'x');
    auVar45[1] = -(cStack_1af == 'n');
    auVar45[2] = -(cStack_1ae == '-');
    auVar45[3] = -(cStack_1ad == '-');
    auVar45[4] = -(cStack_1ac == '1');
    auVar45[5] = -(cStack_1ab == '0');
    auVar45[6] = -(cStack_1aa == 'c');
    auVar45[7] = -(cStack_1a9 == 'l');
    auVar45[8] = -(cStack_1a8 == '1');
    auVar45[9] = -(cStack_1a7 == 'a');
    auVar45[10] = -(cStack_1a6 == '0');
    auVar45[0xb] = -(cStack_1a5 == 'b');
    auVar45[0xc] = -(cStack_1a4 == '6');
    auVar45[0xd] = -(cStack_1a3 == '6');
    auVar45[0xe] = -(cStack_1a2 == '0');
    auVar45[0xf] = -(cStack_1a1 == 'p');
    auVar85[0] = -(cStack_1ab == '0');
    auVar85[1] = -(cStack_1aa == 'c');
    auVar85[2] = -(cStack_1a9 == 'l');
    auVar85[3] = -(cStack_1a8 == '1');
    auVar85[4] = -(cStack_1a7 == 'a');
    auVar85[5] = -(cStack_1a6 == '0');
    auVar85[6] = -(cStack_1a5 == 'b');
    auVar85[7] = -(cStack_1a4 == '6');
    auVar85[8] = -(cStack_1a3 == '6');
    auVar85[9] = -(cStack_1a2 == '0');
    auVar85[10] = -(cStack_1a1 == 'p');
    auVar85[0xb] = -(cStack_1a0 == '.');
    auVar85[0xc] = -(cStack_19f == 'c');
    auVar85[0xd] = -(cStack_19e == 'o');
    auVar85[0xe] = -(cStack_19d == 'm');
    auVar85[0xf] = -(cStack_19c == '\0');
    auVar45 = auVar45 & auVar85;
    if ((ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) | (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar45[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160b54;
    puStack_2b8 = (undefined1 *)0x16058d;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 != 0) goto LAB_00160b59;
    puStack_2b8 = (undefined1 *)0x1605a7;
    memset(acStack_2b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1605bb;
    memset(&cStack_1b0,0,0x100);
    puStack_2b8 = (undefined1 *)0x1605d9;
    lVar5 = uv__idna_toascii(run_test_idna_toascii::s_49,run_test_idna_toascii::s_49 + 0x13,
                             acStack_2b0,&cStack_1b0);
    if (lVar5 != 0x18) goto LAB_00160b5e;
    auVar76[0] = -(cStack_2a0 == '6');
    auVar76[1] = -(cStack_29f == '0');
    auVar76[2] = -(cStack_29e == 'k');
    auVar76[3] = -(cStack_29d == '.');
    auVar76[4] = -(cStack_29c == 'c');
    auVar76[5] = -(cStack_29b == 'o');
    auVar76[6] = -(cStack_29a == 'm');
    auVar76[7] = -(cStack_299 == '\0');
    auVar76[8] = 0xff;
    auVar76[9] = 0xff;
    auVar76[10] = 0xff;
    auVar76[0xb] = 0xff;
    auVar76[0xc] = 0xff;
    auVar76[0xd] = 0xff;
    auVar76[0xe] = 0xff;
    auVar76[0xf] = 0xff;
    auVar46[0] = -(acStack_2b0[0] == 'x');
    auVar46[1] = -(acStack_2b0[1] == 'n');
    auVar46[2] = -(acStack_2b0[2] == '-');
    auVar46[3] = -(acStack_2b0[3] == '-');
    auVar46[4] = -(cStack_2ac == 'm');
    auVar46[5] = -(cStack_2ab == 'g');
    auVar46[6] = -(cStack_2aa == 'b');
    auVar46[7] = -(cStack_2a9 == 'a');
    auVar46[8] = -(cStack_2a8 == '3');
    auVar46[9] = -(cStack_2a7 == 'g');
    auVar46[10] = -(cStack_2a6 == 'c');
    auVar46[0xb] = -(cStack_2a5 == 'h');
    auVar46[0xc] = -(cStack_2a4 == '3');
    auVar46[0xd] = -(cStack_2a3 == '1');
    auVar46[0xe] = -(cStack_2a2 == 'f');
    auVar46[0xf] = -(cStack_2a1 == '0');
    auVar46 = auVar46 & auVar76;
    if ((ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) | (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar46[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160b63;
    puStack_2b8 = (undefined1 *)0x16061c;
    sVar6 = strlen(acStack_2b0);
    puStack_2b8 = (undefined1 *)0x160638;
    lVar5 = uv__idna_toascii(acStack_2b0,acStack_2b0 + sVar6,&cStack_1b0,acStack_b0);
    if (lVar5 != 0x18) goto LAB_00160b68;
    auVar47[0] = -(cStack_1b0 == 'x');
    auVar47[1] = -(cStack_1af == 'n');
    auVar47[2] = -(cStack_1ae == '-');
    auVar47[3] = -(cStack_1ad == '-');
    auVar47[4] = -(cStack_1ac == 'm');
    auVar47[5] = -(cStack_1ab == 'g');
    auVar47[6] = -(cStack_1aa == 'b');
    auVar47[7] = -(cStack_1a9 == 'a');
    auVar47[8] = -(cStack_1a8 == '3');
    auVar47[9] = -(cStack_1a7 == 'g');
    auVar47[10] = -(cStack_1a6 == 'c');
    auVar47[0xb] = -(cStack_1a5 == 'h');
    auVar47[0xc] = -(cStack_1a4 == '3');
    auVar47[0xd] = -(cStack_1a3 == '1');
    auVar47[0xe] = -(cStack_1a2 == 'f');
    auVar47[0xf] = -(cStack_1a1 == '0');
    auVar77[0] = -(cStack_1a0 == '6');
    auVar77[1] = -(cStack_19f == '0');
    auVar77[2] = -(cStack_19e == 'k');
    auVar77[3] = -(cStack_19d == '.');
    auVar77[4] = -(cStack_19c == 'c');
    auVar77[5] = -(cStack_19b == 'o');
    auVar77[6] = -(cStack_19a == 'm');
    auVar77[7] = -(cStack_199 == '\0');
    auVar77[8] = 0xff;
    auVar77[9] = 0xff;
    auVar77[10] = 0xff;
    auVar77[0xb] = 0xff;
    auVar77[0xc] = 0xff;
    auVar77[0xd] = 0xff;
    auVar77[0xe] = 0xff;
    auVar77[0xf] = 0xff;
    auVar77 = auVar77 & auVar47;
    if ((ushort)((ushort)(SUB161(auVar77 >> 7,0) & 1) | (ushort)(SUB161(auVar77 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar77 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar77 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar77 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar77 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar77 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar77 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar77 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar77 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar77 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar77 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar77 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar77 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar77 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar77[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00160b6d;
    puStack_2b8 = (undefined1 *)0x1606a6;
    iVar4 = bcmp(acStack_2b0,&cStack_1b0,0x100);
    if (iVar4 == 0) {
      return 0;
    }
  }
  else {
    puStack_2b8 = (undefined1 *)0x1606c2;
    run_test_idna_toascii_cold_1();
LAB_001606c2:
    puStack_2b8 = (undefined1 *)0x1606c7;
    run_test_idna_toascii_cold_2();
LAB_001606c7:
    puStack_2b8 = (undefined1 *)0x1606cc;
    run_test_idna_toascii_cold_3();
LAB_001606cc:
    puStack_2b8 = (undefined1 *)0x1606d1;
    run_test_idna_toascii_cold_4();
LAB_001606d1:
    puStack_2b8 = (undefined1 *)0x1606d6;
    run_test_idna_toascii_cold_5();
LAB_001606d6:
    puStack_2b8 = (undefined1 *)0x1606db;
    run_test_idna_toascii_cold_6();
LAB_001606db:
    puStack_2b8 = (undefined1 *)0x1606e0;
    run_test_idna_toascii_cold_7();
LAB_001606e0:
    puStack_2b8 = (undefined1 *)0x1606e5;
    run_test_idna_toascii_cold_8();
LAB_001606e5:
    puStack_2b8 = (undefined1 *)0x1606ea;
    run_test_idna_toascii_cold_9();
LAB_001606ea:
    puStack_2b8 = (undefined1 *)0x1606ef;
    run_test_idna_toascii_cold_10();
LAB_001606ef:
    puStack_2b8 = (undefined1 *)0x1606f4;
    run_test_idna_toascii_cold_11();
LAB_001606f4:
    puStack_2b8 = (undefined1 *)0x1606f9;
    run_test_idna_toascii_cold_12();
LAB_001606f9:
    puStack_2b8 = (undefined1 *)0x1606fe;
    run_test_idna_toascii_cold_13();
LAB_001606fe:
    puStack_2b8 = (undefined1 *)0x160703;
    run_test_idna_toascii_cold_14();
LAB_00160703:
    puStack_2b8 = (undefined1 *)0x160708;
    run_test_idna_toascii_cold_15();
LAB_00160708:
    puStack_2b8 = (undefined1 *)0x16070d;
    run_test_idna_toascii_cold_16();
LAB_0016070d:
    puStack_2b8 = (undefined1 *)0x160712;
    run_test_idna_toascii_cold_17();
LAB_00160712:
    puStack_2b8 = (undefined1 *)0x160717;
    run_test_idna_toascii_cold_18();
LAB_00160717:
    puStack_2b8 = (undefined1 *)0x16071c;
    run_test_idna_toascii_cold_19();
LAB_0016071c:
    puStack_2b8 = (undefined1 *)0x160721;
    run_test_idna_toascii_cold_20();
LAB_00160721:
    puStack_2b8 = (undefined1 *)0x160726;
    run_test_idna_toascii_cold_21();
LAB_00160726:
    puStack_2b8 = (undefined1 *)0x16072b;
    run_test_idna_toascii_cold_22();
LAB_0016072b:
    puStack_2b8 = (undefined1 *)0x160730;
    run_test_idna_toascii_cold_23();
LAB_00160730:
    puStack_2b8 = (undefined1 *)0x160735;
    run_test_idna_toascii_cold_24();
LAB_00160735:
    puStack_2b8 = (undefined1 *)0x16073a;
    run_test_idna_toascii_cold_25();
LAB_0016073a:
    puStack_2b8 = (undefined1 *)0x16073f;
    run_test_idna_toascii_cold_26();
LAB_0016073f:
    puStack_2b8 = (undefined1 *)0x160744;
    run_test_idna_toascii_cold_27();
LAB_00160744:
    puStack_2b8 = (undefined1 *)0x160749;
    run_test_idna_toascii_cold_28();
LAB_00160749:
    puStack_2b8 = (undefined1 *)0x16074e;
    run_test_idna_toascii_cold_29();
LAB_0016074e:
    puStack_2b8 = (undefined1 *)0x160753;
    run_test_idna_toascii_cold_30();
LAB_00160753:
    puStack_2b8 = (undefined1 *)0x160758;
    run_test_idna_toascii_cold_31();
LAB_00160758:
    puStack_2b8 = (undefined1 *)0x16075d;
    run_test_idna_toascii_cold_32();
LAB_0016075d:
    puStack_2b8 = (undefined1 *)0x160762;
    run_test_idna_toascii_cold_33();
LAB_00160762:
    puStack_2b8 = (undefined1 *)0x160767;
    run_test_idna_toascii_cold_34();
LAB_00160767:
    puStack_2b8 = (undefined1 *)0x16076c;
    run_test_idna_toascii_cold_35();
LAB_0016076c:
    puStack_2b8 = (undefined1 *)0x160771;
    run_test_idna_toascii_cold_36();
LAB_00160771:
    puStack_2b8 = (undefined1 *)0x160776;
    run_test_idna_toascii_cold_37();
LAB_00160776:
    puStack_2b8 = (undefined1 *)0x16077b;
    run_test_idna_toascii_cold_38();
LAB_0016077b:
    puStack_2b8 = (undefined1 *)0x160780;
    run_test_idna_toascii_cold_39();
LAB_00160780:
    puStack_2b8 = (undefined1 *)0x160785;
    run_test_idna_toascii_cold_40();
LAB_00160785:
    puStack_2b8 = (undefined1 *)0x16078a;
    run_test_idna_toascii_cold_41();
LAB_0016078a:
    puStack_2b8 = (undefined1 *)0x16078f;
    run_test_idna_toascii_cold_42();
LAB_0016078f:
    puStack_2b8 = (undefined1 *)0x160794;
    run_test_idna_toascii_cold_43();
LAB_00160794:
    puStack_2b8 = (undefined1 *)0x160799;
    run_test_idna_toascii_cold_44();
LAB_00160799:
    puStack_2b8 = (undefined1 *)0x16079e;
    run_test_idna_toascii_cold_45();
LAB_0016079e:
    puStack_2b8 = (undefined1 *)0x1607a3;
    run_test_idna_toascii_cold_46();
LAB_001607a3:
    puStack_2b8 = (undefined1 *)0x1607a8;
    run_test_idna_toascii_cold_47();
LAB_001607a8:
    puStack_2b8 = (undefined1 *)0x1607ad;
    run_test_idna_toascii_cold_48();
LAB_001607ad:
    puStack_2b8 = (undefined1 *)0x1607b2;
    run_test_idna_toascii_cold_49();
LAB_001607b2:
    puStack_2b8 = (undefined1 *)0x1607b7;
    run_test_idna_toascii_cold_50();
LAB_001607b7:
    puStack_2b8 = (undefined1 *)0x1607bc;
    run_test_idna_toascii_cold_51();
LAB_001607bc:
    puStack_2b8 = (undefined1 *)0x1607c1;
    run_test_idna_toascii_cold_52();
LAB_001607c1:
    puStack_2b8 = (undefined1 *)0x1607c6;
    run_test_idna_toascii_cold_53();
LAB_001607c6:
    puStack_2b8 = (undefined1 *)0x1607cb;
    run_test_idna_toascii_cold_54();
LAB_001607cb:
    puStack_2b8 = (undefined1 *)0x1607d0;
    run_test_idna_toascii_cold_55();
LAB_001607d0:
    puStack_2b8 = (undefined1 *)0x1607d5;
    run_test_idna_toascii_cold_56();
LAB_001607d5:
    puStack_2b8 = (undefined1 *)0x1607da;
    run_test_idna_toascii_cold_57();
LAB_001607da:
    puStack_2b8 = (undefined1 *)0x1607df;
    run_test_idna_toascii_cold_58();
LAB_001607df:
    puStack_2b8 = (undefined1 *)0x1607e4;
    run_test_idna_toascii_cold_59();
LAB_001607e4:
    puStack_2b8 = (undefined1 *)0x1607e9;
    run_test_idna_toascii_cold_60();
LAB_001607e9:
    puStack_2b8 = (undefined1 *)0x1607ee;
    run_test_idna_toascii_cold_61();
LAB_001607ee:
    puStack_2b8 = (undefined1 *)0x1607f3;
    run_test_idna_toascii_cold_62();
LAB_001607f3:
    puStack_2b8 = (undefined1 *)0x1607f8;
    run_test_idna_toascii_cold_63();
LAB_001607f8:
    puStack_2b8 = (undefined1 *)0x1607fd;
    run_test_idna_toascii_cold_64();
LAB_001607fd:
    puStack_2b8 = (undefined1 *)0x160802;
    run_test_idna_toascii_cold_65();
LAB_00160802:
    puStack_2b8 = (undefined1 *)0x160807;
    run_test_idna_toascii_cold_66();
LAB_00160807:
    puStack_2b8 = (undefined1 *)0x16080c;
    run_test_idna_toascii_cold_67();
LAB_0016080c:
    puStack_2b8 = (undefined1 *)0x160811;
    run_test_idna_toascii_cold_68();
LAB_00160811:
    puStack_2b8 = (undefined1 *)0x160816;
    run_test_idna_toascii_cold_69();
LAB_00160816:
    puStack_2b8 = (undefined1 *)0x16081b;
    run_test_idna_toascii_cold_70();
LAB_0016081b:
    puStack_2b8 = (undefined1 *)0x160820;
    run_test_idna_toascii_cold_71();
LAB_00160820:
    puStack_2b8 = (undefined1 *)0x160825;
    run_test_idna_toascii_cold_72();
LAB_00160825:
    puStack_2b8 = (undefined1 *)0x16082a;
    run_test_idna_toascii_cold_73();
LAB_0016082a:
    puStack_2b8 = (undefined1 *)0x16082f;
    run_test_idna_toascii_cold_74();
LAB_0016082f:
    puStack_2b8 = (undefined1 *)0x160834;
    run_test_idna_toascii_cold_75();
LAB_00160834:
    puStack_2b8 = (undefined1 *)0x160839;
    run_test_idna_toascii_cold_76();
LAB_00160839:
    puStack_2b8 = (undefined1 *)0x16083e;
    run_test_idna_toascii_cold_77();
LAB_0016083e:
    puStack_2b8 = (undefined1 *)0x160843;
    run_test_idna_toascii_cold_78();
LAB_00160843:
    puStack_2b8 = (undefined1 *)0x160848;
    run_test_idna_toascii_cold_79();
LAB_00160848:
    puStack_2b8 = (undefined1 *)0x16084d;
    run_test_idna_toascii_cold_80();
LAB_0016084d:
    puStack_2b8 = (undefined1 *)0x160852;
    run_test_idna_toascii_cold_81();
LAB_00160852:
    puStack_2b8 = (undefined1 *)0x160857;
    run_test_idna_toascii_cold_82();
LAB_00160857:
    puStack_2b8 = (undefined1 *)0x16085c;
    run_test_idna_toascii_cold_83();
LAB_0016085c:
    puStack_2b8 = (undefined1 *)0x160861;
    run_test_idna_toascii_cold_84();
LAB_00160861:
    puStack_2b8 = (undefined1 *)0x160866;
    run_test_idna_toascii_cold_85();
LAB_00160866:
    puStack_2b8 = (undefined1 *)0x16086b;
    run_test_idna_toascii_cold_86();
LAB_0016086b:
    puStack_2b8 = (undefined1 *)0x160870;
    run_test_idna_toascii_cold_87();
LAB_00160870:
    puStack_2b8 = (undefined1 *)0x160875;
    run_test_idna_toascii_cold_88();
LAB_00160875:
    puStack_2b8 = (undefined1 *)0x16087a;
    run_test_idna_toascii_cold_89();
LAB_0016087a:
    puStack_2b8 = (undefined1 *)0x16087f;
    run_test_idna_toascii_cold_90();
LAB_0016087f:
    puStack_2b8 = (undefined1 *)0x160884;
    run_test_idna_toascii_cold_91();
LAB_00160884:
    puStack_2b8 = (undefined1 *)0x160889;
    run_test_idna_toascii_cold_92();
LAB_00160889:
    puStack_2b8 = (undefined1 *)0x16088e;
    run_test_idna_toascii_cold_93();
LAB_0016088e:
    puStack_2b8 = (undefined1 *)0x160893;
    run_test_idna_toascii_cold_94();
LAB_00160893:
    puStack_2b8 = (undefined1 *)0x160898;
    run_test_idna_toascii_cold_95();
LAB_00160898:
    puStack_2b8 = (undefined1 *)0x16089d;
    run_test_idna_toascii_cold_96();
LAB_0016089d:
    puStack_2b8 = (undefined1 *)0x1608a2;
    run_test_idna_toascii_cold_97();
LAB_001608a2:
    puStack_2b8 = (undefined1 *)0x1608a7;
    run_test_idna_toascii_cold_98();
LAB_001608a7:
    puStack_2b8 = (undefined1 *)0x1608ac;
    run_test_idna_toascii_cold_99();
LAB_001608ac:
    puStack_2b8 = (undefined1 *)0x1608b1;
    run_test_idna_toascii_cold_100();
LAB_001608b1:
    puStack_2b8 = (undefined1 *)0x1608b6;
    run_test_idna_toascii_cold_101();
LAB_001608b6:
    puStack_2b8 = (undefined1 *)0x1608bb;
    run_test_idna_toascii_cold_102();
LAB_001608bb:
    puStack_2b8 = (undefined1 *)0x1608c0;
    run_test_idna_toascii_cold_103();
LAB_001608c0:
    puStack_2b8 = (undefined1 *)0x1608c5;
    run_test_idna_toascii_cold_104();
LAB_001608c5:
    puStack_2b8 = (undefined1 *)0x1608ca;
    run_test_idna_toascii_cold_105();
LAB_001608ca:
    puStack_2b8 = (undefined1 *)0x1608cf;
    run_test_idna_toascii_cold_106();
LAB_001608cf:
    puStack_2b8 = (undefined1 *)0x1608d4;
    run_test_idna_toascii_cold_107();
LAB_001608d4:
    puStack_2b8 = (undefined1 *)0x1608d9;
    run_test_idna_toascii_cold_108();
LAB_001608d9:
    puStack_2b8 = (undefined1 *)0x1608de;
    run_test_idna_toascii_cold_109();
LAB_001608de:
    puStack_2b8 = (undefined1 *)0x1608e3;
    run_test_idna_toascii_cold_110();
LAB_001608e3:
    puStack_2b8 = (undefined1 *)0x1608e8;
    run_test_idna_toascii_cold_111();
LAB_001608e8:
    puStack_2b8 = (undefined1 *)0x1608ed;
    run_test_idna_toascii_cold_112();
LAB_001608ed:
    puStack_2b8 = (undefined1 *)0x1608f2;
    run_test_idna_toascii_cold_113();
LAB_001608f2:
    puStack_2b8 = (undefined1 *)0x1608f7;
    run_test_idna_toascii_cold_114();
LAB_001608f7:
    puStack_2b8 = (undefined1 *)0x1608fc;
    run_test_idna_toascii_cold_115();
LAB_001608fc:
    puStack_2b8 = (undefined1 *)0x160901;
    run_test_idna_toascii_cold_116();
LAB_00160901:
    puStack_2b8 = (undefined1 *)0x160906;
    run_test_idna_toascii_cold_117();
LAB_00160906:
    puStack_2b8 = (undefined1 *)0x16090b;
    run_test_idna_toascii_cold_118();
LAB_0016090b:
    puStack_2b8 = (undefined1 *)0x160910;
    run_test_idna_toascii_cold_119();
LAB_00160910:
    puStack_2b8 = (undefined1 *)0x160915;
    run_test_idna_toascii_cold_120();
LAB_00160915:
    puStack_2b8 = (undefined1 *)0x16091a;
    run_test_idna_toascii_cold_121();
LAB_0016091a:
    puStack_2b8 = (undefined1 *)0x16091f;
    run_test_idna_toascii_cold_122();
LAB_0016091f:
    puStack_2b8 = (undefined1 *)0x160924;
    run_test_idna_toascii_cold_123();
LAB_00160924:
    puStack_2b8 = (undefined1 *)0x160929;
    run_test_idna_toascii_cold_124();
LAB_00160929:
    puStack_2b8 = (undefined1 *)0x16092e;
    run_test_idna_toascii_cold_125();
LAB_0016092e:
    puStack_2b8 = (undefined1 *)0x160933;
    run_test_idna_toascii_cold_126();
LAB_00160933:
    puStack_2b8 = (undefined1 *)0x160938;
    run_test_idna_toascii_cold_127();
LAB_00160938:
    puStack_2b8 = (undefined1 *)0x16093d;
    run_test_idna_toascii_cold_128();
LAB_0016093d:
    puStack_2b8 = (undefined1 *)0x160942;
    run_test_idna_toascii_cold_129();
LAB_00160942:
    puStack_2b8 = (undefined1 *)0x160947;
    run_test_idna_toascii_cold_130();
LAB_00160947:
    puStack_2b8 = (undefined1 *)0x16094c;
    run_test_idna_toascii_cold_131();
LAB_0016094c:
    puStack_2b8 = (undefined1 *)0x160951;
    run_test_idna_toascii_cold_132();
LAB_00160951:
    puStack_2b8 = (undefined1 *)0x160956;
    run_test_idna_toascii_cold_133();
LAB_00160956:
    puStack_2b8 = (undefined1 *)0x16095b;
    run_test_idna_toascii_cold_134();
LAB_0016095b:
    puStack_2b8 = (undefined1 *)0x160960;
    run_test_idna_toascii_cold_135();
LAB_00160960:
    puStack_2b8 = (undefined1 *)0x160965;
    run_test_idna_toascii_cold_136();
LAB_00160965:
    puStack_2b8 = (undefined1 *)0x16096a;
    run_test_idna_toascii_cold_137();
LAB_0016096a:
    puStack_2b8 = (undefined1 *)0x16096f;
    run_test_idna_toascii_cold_138();
LAB_0016096f:
    puStack_2b8 = (undefined1 *)0x160974;
    run_test_idna_toascii_cold_139();
LAB_00160974:
    puStack_2b8 = (undefined1 *)0x160979;
    run_test_idna_toascii_cold_140();
LAB_00160979:
    puStack_2b8 = (undefined1 *)0x16097e;
    run_test_idna_toascii_cold_141();
LAB_0016097e:
    puStack_2b8 = (undefined1 *)0x160983;
    run_test_idna_toascii_cold_142();
LAB_00160983:
    puStack_2b8 = (undefined1 *)0x160988;
    run_test_idna_toascii_cold_143();
LAB_00160988:
    puStack_2b8 = (undefined1 *)0x16098d;
    run_test_idna_toascii_cold_144();
LAB_0016098d:
    puStack_2b8 = (undefined1 *)0x160992;
    run_test_idna_toascii_cold_145();
LAB_00160992:
    puStack_2b8 = (undefined1 *)0x160997;
    run_test_idna_toascii_cold_146();
LAB_00160997:
    puStack_2b8 = (undefined1 *)0x16099c;
    run_test_idna_toascii_cold_147();
LAB_0016099c:
    puStack_2b8 = (undefined1 *)0x1609a1;
    run_test_idna_toascii_cold_148();
LAB_001609a1:
    puStack_2b8 = (undefined1 *)0x1609a6;
    run_test_idna_toascii_cold_149();
LAB_001609a6:
    puStack_2b8 = (undefined1 *)0x1609ab;
    run_test_idna_toascii_cold_150();
LAB_001609ab:
    puStack_2b8 = (undefined1 *)0x1609b0;
    run_test_idna_toascii_cold_151();
LAB_001609b0:
    puStack_2b8 = (undefined1 *)0x1609b5;
    run_test_idna_toascii_cold_152();
LAB_001609b5:
    puStack_2b8 = (undefined1 *)0x1609ba;
    run_test_idna_toascii_cold_153();
LAB_001609ba:
    puStack_2b8 = (undefined1 *)0x1609bf;
    run_test_idna_toascii_cold_154();
LAB_001609bf:
    puStack_2b8 = (undefined1 *)0x1609c4;
    run_test_idna_toascii_cold_155();
LAB_001609c4:
    puStack_2b8 = (undefined1 *)0x1609c9;
    run_test_idna_toascii_cold_156();
LAB_001609c9:
    puStack_2b8 = (undefined1 *)0x1609ce;
    run_test_idna_toascii_cold_157();
LAB_001609ce:
    puStack_2b8 = (undefined1 *)0x1609d3;
    run_test_idna_toascii_cold_158();
LAB_001609d3:
    puStack_2b8 = (undefined1 *)0x1609d8;
    run_test_idna_toascii_cold_159();
LAB_001609d8:
    puStack_2b8 = (undefined1 *)0x1609dd;
    run_test_idna_toascii_cold_160();
LAB_001609dd:
    puStack_2b8 = (undefined1 *)0x1609e2;
    run_test_idna_toascii_cold_161();
LAB_001609e2:
    puStack_2b8 = (undefined1 *)0x1609e7;
    run_test_idna_toascii_cold_162();
LAB_001609e7:
    puStack_2b8 = (undefined1 *)0x1609ec;
    run_test_idna_toascii_cold_163();
LAB_001609ec:
    puStack_2b8 = (undefined1 *)0x1609f1;
    run_test_idna_toascii_cold_164();
LAB_001609f1:
    puStack_2b8 = (undefined1 *)0x1609f6;
    run_test_idna_toascii_cold_165();
LAB_001609f6:
    puStack_2b8 = (undefined1 *)0x1609fb;
    run_test_idna_toascii_cold_166();
LAB_001609fb:
    puStack_2b8 = (undefined1 *)0x160a00;
    run_test_idna_toascii_cold_167();
LAB_00160a00:
    puStack_2b8 = (undefined1 *)0x160a05;
    run_test_idna_toascii_cold_168();
LAB_00160a05:
    puStack_2b8 = (undefined1 *)0x160a0a;
    run_test_idna_toascii_cold_169();
LAB_00160a0a:
    puStack_2b8 = (undefined1 *)0x160a0f;
    run_test_idna_toascii_cold_170();
LAB_00160a0f:
    puStack_2b8 = (undefined1 *)0x160a14;
    run_test_idna_toascii_cold_171();
LAB_00160a14:
    puStack_2b8 = (undefined1 *)0x160a19;
    run_test_idna_toascii_cold_172();
LAB_00160a19:
    puStack_2b8 = (undefined1 *)0x160a1e;
    run_test_idna_toascii_cold_173();
LAB_00160a1e:
    puStack_2b8 = (undefined1 *)0x160a23;
    run_test_idna_toascii_cold_174();
LAB_00160a23:
    puStack_2b8 = (undefined1 *)0x160a28;
    run_test_idna_toascii_cold_175();
LAB_00160a28:
    puStack_2b8 = (undefined1 *)0x160a2d;
    run_test_idna_toascii_cold_176();
LAB_00160a2d:
    puStack_2b8 = (undefined1 *)0x160a32;
    run_test_idna_toascii_cold_177();
LAB_00160a32:
    puStack_2b8 = (undefined1 *)0x160a37;
    run_test_idna_toascii_cold_178();
LAB_00160a37:
    puStack_2b8 = (undefined1 *)0x160a3c;
    run_test_idna_toascii_cold_179();
LAB_00160a3c:
    puStack_2b8 = (undefined1 *)0x160a41;
    run_test_idna_toascii_cold_180();
LAB_00160a41:
    puStack_2b8 = (undefined1 *)0x160a46;
    run_test_idna_toascii_cold_181();
LAB_00160a46:
    puStack_2b8 = (undefined1 *)0x160a4b;
    run_test_idna_toascii_cold_182();
LAB_00160a4b:
    puStack_2b8 = (undefined1 *)0x160a50;
    run_test_idna_toascii_cold_183();
LAB_00160a50:
    puStack_2b8 = (undefined1 *)0x160a55;
    run_test_idna_toascii_cold_184();
LAB_00160a55:
    puStack_2b8 = (undefined1 *)0x160a5a;
    run_test_idna_toascii_cold_185();
LAB_00160a5a:
    puStack_2b8 = (undefined1 *)0x160a5f;
    run_test_idna_toascii_cold_186();
LAB_00160a5f:
    puStack_2b8 = (undefined1 *)0x160a64;
    run_test_idna_toascii_cold_187();
LAB_00160a64:
    puStack_2b8 = (undefined1 *)0x160a69;
    run_test_idna_toascii_cold_188();
LAB_00160a69:
    puStack_2b8 = (undefined1 *)0x160a6e;
    run_test_idna_toascii_cold_189();
LAB_00160a6e:
    puStack_2b8 = (undefined1 *)0x160a73;
    run_test_idna_toascii_cold_190();
LAB_00160a73:
    puStack_2b8 = (undefined1 *)0x160a78;
    run_test_idna_toascii_cold_191();
LAB_00160a78:
    puStack_2b8 = (undefined1 *)0x160a7d;
    run_test_idna_toascii_cold_192();
LAB_00160a7d:
    puStack_2b8 = (undefined1 *)0x160a82;
    run_test_idna_toascii_cold_193();
LAB_00160a82:
    puStack_2b8 = (undefined1 *)0x160a87;
    run_test_idna_toascii_cold_194();
LAB_00160a87:
    puStack_2b8 = (undefined1 *)0x160a8c;
    run_test_idna_toascii_cold_195();
LAB_00160a8c:
    puStack_2b8 = (undefined1 *)0x160a91;
    run_test_idna_toascii_cold_196();
LAB_00160a91:
    puStack_2b8 = (undefined1 *)0x160a96;
    run_test_idna_toascii_cold_197();
LAB_00160a96:
    puStack_2b8 = (undefined1 *)0x160a9b;
    run_test_idna_toascii_cold_198();
LAB_00160a9b:
    puStack_2b8 = (undefined1 *)0x160aa0;
    run_test_idna_toascii_cold_199();
LAB_00160aa0:
    puStack_2b8 = (undefined1 *)0x160aa5;
    run_test_idna_toascii_cold_200();
LAB_00160aa5:
    puStack_2b8 = (undefined1 *)0x160aaa;
    run_test_idna_toascii_cold_201();
LAB_00160aaa:
    puStack_2b8 = (undefined1 *)0x160aaf;
    run_test_idna_toascii_cold_202();
LAB_00160aaf:
    puStack_2b8 = (undefined1 *)0x160ab4;
    run_test_idna_toascii_cold_203();
LAB_00160ab4:
    puStack_2b8 = (undefined1 *)0x160ab9;
    run_test_idna_toascii_cold_204();
LAB_00160ab9:
    puStack_2b8 = (undefined1 *)0x160abe;
    run_test_idna_toascii_cold_205();
LAB_00160abe:
    puStack_2b8 = (undefined1 *)0x160ac3;
    run_test_idna_toascii_cold_206();
LAB_00160ac3:
    puStack_2b8 = (undefined1 *)0x160ac8;
    run_test_idna_toascii_cold_207();
LAB_00160ac8:
    puStack_2b8 = (undefined1 *)0x160acd;
    run_test_idna_toascii_cold_208();
LAB_00160acd:
    puStack_2b8 = (undefined1 *)0x160ad2;
    run_test_idna_toascii_cold_209();
LAB_00160ad2:
    puStack_2b8 = (undefined1 *)0x160ad7;
    run_test_idna_toascii_cold_210();
LAB_00160ad7:
    puStack_2b8 = (undefined1 *)0x160adc;
    run_test_idna_toascii_cold_211();
LAB_00160adc:
    puStack_2b8 = (undefined1 *)0x160ae1;
    run_test_idna_toascii_cold_212();
LAB_00160ae1:
    puStack_2b8 = (undefined1 *)0x160ae6;
    run_test_idna_toascii_cold_213();
LAB_00160ae6:
    puStack_2b8 = (undefined1 *)0x160aeb;
    run_test_idna_toascii_cold_214();
LAB_00160aeb:
    puStack_2b8 = (undefined1 *)0x160af0;
    run_test_idna_toascii_cold_215();
LAB_00160af0:
    puStack_2b8 = (undefined1 *)0x160af5;
    run_test_idna_toascii_cold_216();
LAB_00160af5:
    puStack_2b8 = (undefined1 *)0x160afa;
    run_test_idna_toascii_cold_217();
LAB_00160afa:
    puStack_2b8 = (undefined1 *)0x160aff;
    run_test_idna_toascii_cold_218();
LAB_00160aff:
    puStack_2b8 = (undefined1 *)0x160b04;
    run_test_idna_toascii_cold_219();
LAB_00160b04:
    puStack_2b8 = (undefined1 *)0x160b09;
    run_test_idna_toascii_cold_220();
LAB_00160b09:
    puStack_2b8 = (undefined1 *)0x160b0e;
    run_test_idna_toascii_cold_221();
LAB_00160b0e:
    puStack_2b8 = (undefined1 *)0x160b13;
    run_test_idna_toascii_cold_222();
LAB_00160b13:
    puStack_2b8 = (undefined1 *)0x160b18;
    run_test_idna_toascii_cold_223();
LAB_00160b18:
    puStack_2b8 = (undefined1 *)0x160b1d;
    run_test_idna_toascii_cold_224();
LAB_00160b1d:
    puStack_2b8 = (undefined1 *)0x160b22;
    run_test_idna_toascii_cold_225();
LAB_00160b22:
    puStack_2b8 = (undefined1 *)0x160b27;
    run_test_idna_toascii_cold_226();
LAB_00160b27:
    puStack_2b8 = (undefined1 *)0x160b2c;
    run_test_idna_toascii_cold_227();
LAB_00160b2c:
    puStack_2b8 = (undefined1 *)0x160b31;
    run_test_idna_toascii_cold_228();
LAB_00160b31:
    puStack_2b8 = (undefined1 *)0x160b36;
    run_test_idna_toascii_cold_229();
LAB_00160b36:
    puStack_2b8 = (undefined1 *)0x160b3b;
    run_test_idna_toascii_cold_230();
LAB_00160b3b:
    puStack_2b8 = (undefined1 *)0x160b40;
    run_test_idna_toascii_cold_231();
LAB_00160b40:
    puStack_2b8 = (undefined1 *)0x160b45;
    run_test_idna_toascii_cold_232();
LAB_00160b45:
    puStack_2b8 = (undefined1 *)0x160b4a;
    run_test_idna_toascii_cold_233();
LAB_00160b4a:
    puStack_2b8 = (undefined1 *)0x160b4f;
    run_test_idna_toascii_cold_234();
LAB_00160b4f:
    puStack_2b8 = (undefined1 *)0x160b54;
    run_test_idna_toascii_cold_235();
LAB_00160b54:
    puStack_2b8 = (undefined1 *)0x160b59;
    run_test_idna_toascii_cold_236();
LAB_00160b59:
    puStack_2b8 = (undefined1 *)0x160b5e;
    run_test_idna_toascii_cold_237();
LAB_00160b5e:
    puStack_2b8 = (undefined1 *)0x160b63;
    run_test_idna_toascii_cold_238();
LAB_00160b63:
    puStack_2b8 = (undefined1 *)0x160b68;
    run_test_idna_toascii_cold_239();
LAB_00160b68:
    puStack_2b8 = (undefined1 *)0x160b6d;
    run_test_idna_toascii_cold_240();
LAB_00160b6d:
    puStack_2b8 = (undefined1 *)0x160b72;
    run_test_idna_toascii_cold_241();
  }
  puStack_2b8 = (undefined1 *)0x160b77;
  run_test_idna_toascii_cold_242();
  pcVar8 = (char *)0x2;
  puStack_2b8 = acStack_2b0;
  iVar4 = uv_inet_ntop(2,anon_var_dwarf_3cc77,&cStack_2c8,0x10);
  if (iVar4 == 0) {
    auVar48[0] = -(cStack_2c8 == '2');
    auVar48[1] = -(cStack_2c7 == '5');
    auVar48[2] = -(cStack_2c6 == '5');
    auVar48[3] = -(cStack_2c5 == '.');
    auVar48[4] = -(cStack_2c4 == '2');
    auVar48[5] = -(cStack_2c3 == '5');
    auVar48[6] = -(cStack_2c2 == '5');
    auVar48[7] = -(cStack_2c1 == '.');
    auVar48[8] = -(cStack_2c0 == '2');
    auVar48[9] = -(cStack_2bf == '5');
    auVar48[10] = -(cStack_2be == '5');
    auVar48[0xb] = -(cStack_2bd == '.');
    auVar48[0xc] = -(cStack_2bc == '2');
    auVar48[0xd] = -(cStack_2bb == '5');
    auVar48[0xe] = -(cStack_2ba == '5');
    auVar48[0xf] = -(cStack_2b9 == '\0');
    if ((ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) | (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe | (ushort)(auVar48[0xf] >> 7) << 0xf
                ) != 0xffff) goto LAB_00160ce5;
    pcVar8 = (char *)0x2;
    iVar4 = uv_inet_ntop(2,anon_var_dwarf_3cc77,&cStack_2c8,0xf);
    if (iVar4 != -0x1c) goto LAB_00160cea;
    pcVar8 = "127.0.0.1";
    iVar4 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_2d8);
    if (iVar4 != 0) goto LAB_00160cef;
    pcVar8 = "255.255.255.255";
    iVar4 = uv_ip4_addr("255.255.255.255",0x23a3,auStack_2d8);
    if (iVar4 != 0) goto LAB_00160cf4;
    pcVar8 = "255.255.255*000";
    iVar4 = uv_ip4_addr("255.255.255*000",0x23a3,auStack_2d8);
    if (iVar4 != -0x16) goto LAB_00160cf9;
    pcVar8 = "255.255.255.256";
    iVar4 = uv_ip4_addr("255.255.255.256",0x23a3,auStack_2d8);
    if (iVar4 != -0x16) goto LAB_00160cfe;
    pcVar8 = "2555.0.0.0";
    iVar4 = uv_ip4_addr("2555.0.0.0",0x23a3,auStack_2d8);
    if (iVar4 != -0x16) goto LAB_00160d03;
    pcVar8 = "255";
    iVar4 = uv_ip4_addr("255",0x23a3,auStack_2d8);
    if (iVar4 != -0x16) goto LAB_00160d08;
    pcVar8 = (char *)0x2a;
    iVar4 = uv_inet_pton(0x2a,"127.0.0.1",auStack_2d4);
    if (iVar4 == -0x61) {
      uVar7 = uv_default_loop();
      uv_walk(uVar7,close_walk_cb,0);
      uv_run(uVar7,0);
      pcVar8 = (char *)uv_default_loop();
      iVar4 = uv_loop_close(pcVar8);
      if (iVar4 == 0) {
        return 0;
      }
      goto LAB_00160d12;
    }
  }
  else {
    run_test_ip4_addr_cold_1();
LAB_00160ce5:
    run_test_ip4_addr_cold_2();
LAB_00160cea:
    run_test_ip4_addr_cold_3();
LAB_00160cef:
    run_test_ip4_addr_cold_4();
LAB_00160cf4:
    run_test_ip4_addr_cold_5();
LAB_00160cf9:
    run_test_ip4_addr_cold_6();
LAB_00160cfe:
    run_test_ip4_addr_cold_7();
LAB_00160d03:
    run_test_ip4_addr_cold_8();
LAB_00160d08:
    run_test_ip4_addr_cold_9();
  }
  run_test_ip4_addr_cold_10();
LAB_00160d12:
  run_test_ip4_addr_cold_11();
  iVar4 = uv_is_closing();
  if (iVar4 != 0) {
    return iVar4;
  }
  iVar4 = uv_close(pcVar8,0);
  return iVar4;
}

Assistant:

TEST_IMPL(utf8_decode1) {
  const char* p;
  char b[32];
  int i;

  /* ASCII. */
  p = b;
  snprintf(b, sizeof(b), "%c\x7F", 0x00);
  ASSERT(0 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 1);
  ASSERT(127 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);

  /* Two-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xC2\x80\xDF\xBF");
  ASSERT(128 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);
  ASSERT(0x7FF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);

  /* Three-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xE0\xA0\x80\xEF\xBF\xBF");
  ASSERT(0x800 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 3);
  ASSERT(0xFFFF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 6);

  /* Four-byte sequences. */
  p = b;
  snprintf(b, sizeof(b), "\xF0\x90\x80\x80\xF4\x8F\xBF\xBF");
  ASSERT(0x10000 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);
  ASSERT(0x10FFFF == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 8);

  /* Four-byte sequences > U+10FFFF; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xF4\x90\xC0\xC0\xF7\xBF\xBF\xBF");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 8);

  /* Overlong; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xC0\x80\xC1\x80");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 2);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 4);

  /* Surrogate pairs; disallowed. */
  p = b;
  snprintf(b, sizeof(b), "\xED\xA0\x80\xED\xA3\xBF");
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 3);
  ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
  ASSERT(p == b + 6);

  /* Simply illegal. */
  p = b;
  snprintf(b, sizeof(b), "\xF8\xF9\xFA\xFB\xFC\xFD\xFE\xFF");

  for (i = 1; i <= 8; i++) {
    ASSERT((unsigned) -1 == uv__utf8_decode1(&p, b + sizeof(b)));
    ASSERT(p == b + i);
  }

  return 0;
}